

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,
               uint8_t *blimit1,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  undefined8 *puVar11;
  longlong *plVar12;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint8_t *in_R8;
  uint8_t *in_R9;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  ulong uVar18;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  __m128i d7_out;
  __m128i d6_out;
  __m128i d5_out;
  __m128i d4_out;
  __m128i d3_out;
  __m128i d2_out;
  __m128i d1_out;
  __m128i d0_out;
  __m128i d7;
  __m128i d0;
  __m128i p0_2;
  __m128i q0_2;
  __m128i p1_2;
  __m128i p2_2;
  __m128i p3_2;
  __m128i p4_2;
  __m128i p5_2;
  __m128i p6_2;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i p4;
  __m128i p5;
  __m128i p6;
  __m128i p [7];
  __m128i q [7];
  int i;
  int flat2_mask;
  __m128i sum_p;
  __m128i sum_q3;
  __m128i sum_p3;
  __m128i sum_q6;
  __m128i sum_p6;
  __m128i sum_lq;
  __m128i sum_lp;
  __m128i sum_q;
  __m128i sum_p_0;
  __m128i four;
  __m128i eight;
  __m128i flat2_q [6];
  __m128i flat2_p [6];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i qs [2];
  __m128i ps [2];
  __m128i flat2;
  __m128i flat;
  __m128i mask;
  __m128i zero;
  __m128i t80;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i *palVar23;
  __m128i *lt_out;
  __m128i *thr_out;
  __m128i *t80_out;
  __m128i *palVar24;
  __m128i *in_stack_ffffffffffffe438;
  __m128i *x6;
  __m128i *in_stack_ffffffffffffe468;
  __m128i *x7;
  __m128i *x1;
  __m128i *in_stack_ffffffffffffe478;
  __m128i *d1;
  __m128i *in_stack_ffffffffffffe480;
  __m128i *l;
  __m128i *in_stack_ffffffffffffe488;
  __m128i *bl;
  __m128i *in_stack_ffffffffffffe490;
  __m128i *th;
  __m128i *in_stack_ffffffffffffe498;
  __m128i *in_stack_ffffffffffffe4a0;
  __m128i *qs_00;
  __m128i *in_stack_ffffffffffffe4a8;
  __m128i *in_stack_ffffffffffffe4b0;
  __m128i *in_stack_ffffffffffffe4b8;
  longlong lStack_1b40;
  longlong local_1b38;
  longlong lStack_1b30;
  longlong local_1b28;
  longlong lStack_1b20;
  longlong local_1b18;
  longlong lStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  longlong local_1ad8 [4];
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  longlong local_19b8 [2];
  longlong local_19a8 [2];
  longlong local_1998 [2];
  longlong local_1988 [2];
  longlong local_1978 [6];
  longlong local_1948 [6];
  longlong local_1918 [2];
  longlong local_1908 [2];
  longlong local_18f8 [2];
  longlong local_18e8 [3];
  uint8_t *local_18d0;
  uint8_t *local_18c8;
  uint8_t *local_18c0;
  uint8_t *local_18b8;
  int local_18ac;
  undefined8 *local_18a8;
  int local_18a0;
  uint local_189c;
  short local_1898;
  short sStack_1896;
  short sStack_1894;
  short sStack_1892;
  short sStack_1890;
  short sStack_188e;
  short sStack_188c;
  short sStack_188a;
  short local_1888;
  short sStack_1886;
  short sStack_1884;
  short sStack_1882;
  short sStack_1880;
  short sStack_187e;
  short sStack_187c;
  short sStack_187a;
  short local_1878;
  short sStack_1876;
  short sStack_1874;
  short sStack_1872;
  short sStack_1870;
  short sStack_186e;
  short sStack_186c;
  short sStack_186a;
  short local_1868;
  short sStack_1866;
  short sStack_1864;
  short sStack_1862;
  short sStack_1860;
  short sStack_185e;
  short sStack_185c;
  short sStack_185a;
  short local_1858;
  short sStack_1856;
  short sStack_1854;
  short sStack_1852;
  short sStack_1850;
  short sStack_184e;
  short sStack_184c;
  short sStack_184a;
  short local_1848;
  short sStack_1846;
  short sStack_1844;
  short sStack_1842;
  short sStack_1840;
  short sStack_183e;
  short sStack_183c;
  short sStack_183a;
  short local_1838;
  short sStack_1836;
  short sStack_1834;
  short sStack_1832;
  short sStack_1830;
  short sStack_182e;
  short sStack_182c;
  short sStack_182a;
  short local_1828;
  short sStack_1826;
  short sStack_1824;
  short sStack_1822;
  short sStack_1820;
  short sStack_181e;
  short sStack_181c;
  short sStack_181a;
  short local_1818;
  short sStack_1816;
  short sStack_1814;
  short sStack_1812;
  short sStack_1810;
  short sStack_180e;
  short sStack_180c;
  short sStack_180a;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  ushort local_17d8;
  ushort uStack_17d6;
  ushort uStack_17d4;
  ushort uStack_17d2;
  ushort uStack_17d0;
  ushort uStack_17ce;
  ushort uStack_17cc;
  ushort uStack_17ca;
  ushort local_17c8;
  ushort uStack_17c6;
  ushort uStack_17c4;
  ushort uStack_17c2;
  ushort uStack_17c0;
  ushort uStack_17be;
  ushort uStack_17bc;
  ushort uStack_17ba;
  ushort local_17b8;
  ushort uStack_17b6;
  ushort uStack_17b4;
  ushort uStack_17b2;
  ushort uStack_17b0;
  ushort uStack_17ae;
  ushort uStack_17ac;
  ushort uStack_17aa;
  ushort local_17a8;
  ushort uStack_17a6;
  ushort uStack_17a4;
  ushort uStack_17a2;
  ushort uStack_17a0;
  ushort uStack_179e;
  ushort uStack_179c;
  ushort uStack_179a;
  ushort local_1798;
  ushort uStack_1796;
  ushort uStack_1794;
  ushort uStack_1792;
  ushort uStack_1790;
  ushort uStack_178e;
  ushort uStack_178c;
  ushort uStack_178a;
  undefined8 local_1788;
  undefined8 uStack_1780;
  ushort local_1778;
  ushort uStack_1776;
  ushort uStack_1774;
  ushort uStack_1772;
  ushort uStack_1770;
  ushort uStack_176e;
  ushort uStack_176c;
  ushort uStack_176a;
  ushort local_1768;
  ushort uStack_1766;
  ushort uStack_1764;
  ushort uStack_1762;
  ushort uStack_1760;
  ushort uStack_175e;
  ushort uStack_175c;
  ushort uStack_175a;
  ushort local_1758;
  ushort uStack_1756;
  ushort uStack_1754;
  ushort uStack_1752;
  ushort uStack_1750;
  ushort uStack_174e;
  ushort uStack_174c;
  ushort uStack_174a;
  ushort local_1748;
  ushort uStack_1746;
  ushort uStack_1744;
  ushort uStack_1742;
  ushort uStack_1740;
  ushort uStack_173e;
  ushort uStack_173c;
  ushort uStack_173a;
  ushort local_1738;
  ushort uStack_1736;
  ushort uStack_1734;
  ushort uStack_1732;
  ushort uStack_1730;
  ushort uStack_172e;
  ushort uStack_172c;
  ushort uStack_172a;
  ushort local_1728;
  ushort uStack_1726;
  ushort uStack_1724;
  ushort uStack_1722;
  ushort uStack_1720;
  ushort uStack_171e;
  ushort uStack_171c;
  ushort uStack_171a;
  ushort local_1718;
  ushort uStack_1716;
  ushort uStack_1714;
  ushort uStack_1712;
  ushort uStack_1710;
  ushort uStack_170e;
  ushort uStack_170c;
  ushort uStack_170a;
  undefined8 local_1708;
  undefined8 uStack_1700;
  ushort local_16f8;
  ushort uStack_16f6;
  ushort uStack_16f4;
  ushort uStack_16f2;
  ushort uStack_16f0;
  ushort uStack_16ee;
  ushort uStack_16ec;
  ushort uStack_16ea;
  ushort local_16e8;
  ushort uStack_16e6;
  ushort uStack_16e4;
  ushort uStack_16e2;
  ushort uStack_16e0;
  ushort uStack_16de;
  ushort uStack_16dc;
  ushort uStack_16da;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  longlong local_16b8;
  longlong lStack_16b0;
  ulong local_16a8 [4];
  ulong local_1688;
  ulong uStack_1680;
  ulong local_1678;
  ulong uStack_1670;
  ulong local_1668;
  ulong uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  longlong local_1648 [2];
  longlong local_1638 [2];
  longlong local_1628 [2];
  longlong local_1618 [3];
  int local_15fc;
  uint8_t *local_15e8;
  uint8_t *local_15e0;
  uint8_t *local_15d8;
  uint8_t *local_15d0;
  __m128i *local_15c8;
  __m128i *local_15c0;
  undefined8 *local_14a0;
  undefined8 *local_1480;
  longlong local_1478;
  longlong lStack_1470;
  longlong *local_1460;
  longlong local_1458;
  longlong lStack_1450;
  longlong *local_1440;
  longlong local_1438;
  longlong lStack_1430;
  longlong *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 *local_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 *local_13c0;
  undefined8 *local_13b8;
  undefined8 *local_13b0;
  undefined8 *local_13a8;
  undefined8 *local_13a0;
  undefined8 *local_1398;
  undefined8 *local_1390;
  undefined8 *local_1388;
  undefined8 *local_1380;
  undefined8 *local_1378;
  undefined8 *local_1370;
  undefined8 *local_1368;
  undefined8 *local_1360;
  undefined8 *local_1358;
  undefined8 *local_1350;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  ulong local_1328;
  ulong uStack_1320;
  ulong local_1318;
  ulong uStack_1310;
  ulong local_1308;
  ulong uStack_1300;
  ulong local_12f8;
  ulong uStack_12f0;
  ulong local_12e8;
  ulong uStack_12e0;
  ulong local_12d8;
  ulong uStack_12d0;
  ulong local_12c8;
  ulong uStack_12c0;
  ulong local_12b8;
  ulong uStack_12b0;
  ulong local_12a8;
  ulong uStack_12a0;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  ulong local_1258;
  int in_stack_ffffffffffffedb0;
  __m128i *in_stack_ffffffffffffedb8;
  short local_11b8;
  short sStack_11b6;
  short sStack_11b4;
  short sStack_11b2;
  short sStack_11b0;
  short sStack_11ae;
  short sStack_11ac;
  short sStack_11aa;
  short local_11a8;
  short sStack_11a6;
  short sStack_11a4;
  short sStack_11a2;
  short sStack_11a0;
  short sStack_119e;
  short sStack_119c;
  short sStack_119a;
  short local_1198;
  short sStack_1196;
  short sStack_1194;
  short sStack_1192;
  short sStack_1190;
  short sStack_118e;
  short sStack_118c;
  short sStack_118a;
  short local_1128;
  short sStack_1126;
  short sStack_1124;
  short sStack_1122;
  short sStack_1120;
  short sStack_111e;
  short sStack_111c;
  short sStack_111a;
  short local_1118;
  short sStack_1116;
  short sStack_1114;
  short sStack_1112;
  short sStack_1110;
  short sStack_110e;
  short sStack_110c;
  short sStack_110a;
  short local_1108;
  short sStack_1106;
  short sStack_1104;
  short sStack_1102;
  short sStack_1100;
  short sStack_10fe;
  short sStack_10fc;
  short sStack_10fa;
  short local_10a8;
  short sStack_10a6;
  short sStack_10a4;
  short sStack_10a2;
  short sStack_10a0;
  short sStack_109e;
  short sStack_109c;
  short sStack_109a;
  short local_1098;
  short sStack_1096;
  short sStack_1094;
  short sStack_1092;
  short sStack_1090;
  short sStack_108e;
  short sStack_108c;
  short sStack_108a;
  short local_1088;
  short sStack_1086;
  short sStack_1084;
  short sStack_1082;
  short sStack_1080;
  short sStack_107e;
  short sStack_107c;
  short sStack_107a;
  short local_1078;
  short sStack_1076;
  short sStack_1074;
  short sStack_1072;
  short sStack_1070;
  short sStack_106e;
  short sStack_106c;
  short sStack_106a;
  short local_1058;
  short sStack_1056;
  short sStack_1054;
  short sStack_1052;
  short sStack_1050;
  short sStack_104e;
  short sStack_104c;
  short sStack_104a;
  short local_fe8;
  short sStack_fe6;
  short sStack_fe4;
  short sStack_fe2;
  short sStack_fe0;
  short sStack_fde;
  short sStack_fdc;
  short sStack_fda;
  short local_fd8;
  short sStack_fd6;
  short sStack_fd4;
  short sStack_fd2;
  short sStack_fd0;
  short sStack_fce;
  short sStack_fcc;
  short sStack_fca;
  short local_fc8;
  short sStack_fc6;
  short sStack_fc4;
  short sStack_fc2;
  short sStack_fc0;
  short sStack_fbe;
  short sStack_fbc;
  short sStack_fba;
  short local_f68;
  short sStack_f66;
  short sStack_f64;
  short sStack_f62;
  short sStack_f60;
  short sStack_f5e;
  short sStack_f5c;
  short sStack_f5a;
  short local_f58;
  short sStack_f56;
  short sStack_f54;
  short sStack_f52;
  short sStack_f50;
  short sStack_f4e;
  short sStack_f4c;
  short sStack_f4a;
  short local_f48;
  short sStack_f46;
  short sStack_f44;
  short sStack_f42;
  short sStack_f40;
  short sStack_f3e;
  short sStack_f3c;
  short sStack_f3a;
  short local_f38;
  short sStack_f36;
  short sStack_f34;
  short sStack_f32;
  short sStack_f30;
  short sStack_f2e;
  short sStack_f2c;
  short sStack_f2a;
  short local_f18;
  short sStack_f16;
  short sStack_f14;
  short sStack_f12;
  short sStack_f10;
  short sStack_f0e;
  short sStack_f0c;
  short sStack_f0a;
  short local_ea8;
  short sStack_ea6;
  short sStack_ea4;
  short sStack_ea2;
  short sStack_ea0;
  short sStack_e9e;
  short sStack_e9c;
  short sStack_e9a;
  short local_e98;
  short sStack_e96;
  short sStack_e94;
  short sStack_e92;
  short sStack_e90;
  short sStack_e8e;
  short sStack_e8c;
  short sStack_e8a;
  short local_e88;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e80;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  short local_e28;
  short sStack_e26;
  short sStack_e24;
  short sStack_e22;
  short sStack_e20;
  short sStack_e1e;
  short sStack_e1c;
  short sStack_e1a;
  short local_e18;
  short sStack_e16;
  short sStack_e14;
  short sStack_e12;
  short sStack_e10;
  short sStack_e0e;
  short sStack_e0c;
  short sStack_e0a;
  short local_e08;
  short sStack_e06;
  short sStack_e04;
  short sStack_e02;
  short sStack_e00;
  short sStack_dfe;
  short sStack_dfc;
  short sStack_dfa;
  short local_df8;
  short sStack_df6;
  short sStack_df4;
  short sStack_df2;
  short sStack_df0;
  short sStack_dee;
  short sStack_dec;
  short sStack_dea;
  short local_dd8;
  short sStack_dd6;
  short sStack_dd4;
  short sStack_dd2;
  short sStack_dd0;
  short sStack_dce;
  short sStack_dcc;
  short sStack_dca;
  short local_d68;
  short sStack_d66;
  short sStack_d64;
  short sStack_d62;
  short sStack_d60;
  short sStack_d5e;
  short sStack_d5c;
  short sStack_d5a;
  short local_d58;
  short sStack_d56;
  short sStack_d54;
  short sStack_d52;
  short sStack_d50;
  short sStack_d4e;
  short sStack_d4c;
  short sStack_d4a;
  short local_d48;
  short sStack_d46;
  short sStack_d44;
  short sStack_d42;
  short sStack_d40;
  short sStack_d3e;
  short sStack_d3c;
  short sStack_d3a;
  short local_ce8;
  short sStack_ce6;
  short sStack_ce4;
  short sStack_ce2;
  short sStack_ce0;
  short sStack_cde;
  short sStack_cdc;
  short sStack_cda;
  short local_cd8;
  short sStack_cd6;
  short sStack_cd4;
  short sStack_cd2;
  short sStack_cd0;
  short sStack_cce;
  short sStack_ccc;
  short sStack_cca;
  short local_cc8;
  short sStack_cc6;
  short sStack_cc4;
  short sStack_cc2;
  short sStack_cc0;
  short sStack_cbe;
  short sStack_cbc;
  short sStack_cba;
  short local_cb8;
  short sStack_cb6;
  short sStack_cb4;
  short sStack_cb2;
  short sStack_cb0;
  short sStack_cae;
  short sStack_cac;
  short sStack_caa;
  short local_c98;
  short sStack_c96;
  short sStack_c94;
  short sStack_c92;
  short sStack_c90;
  short sStack_c8e;
  short sStack_c8c;
  short sStack_c8a;
  short local_c28;
  short sStack_c26;
  short sStack_c24;
  short sStack_c22;
  short sStack_c20;
  short sStack_c1e;
  short sStack_c1c;
  short sStack_c1a;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  short local_c08;
  short sStack_c06;
  short sStack_c04;
  short sStack_c02;
  short sStack_c00;
  short sStack_bfe;
  short sStack_bfc;
  short sStack_bfa;
  short local_ba8;
  short sStack_ba6;
  short sStack_ba4;
  short sStack_ba2;
  short sStack_ba0;
  short sStack_b9e;
  short sStack_b9c;
  short sStack_b9a;
  short local_b98;
  short sStack_b96;
  short sStack_b94;
  short sStack_b92;
  short sStack_b90;
  short sStack_b8e;
  short sStack_b8c;
  short sStack_b8a;
  short local_b88;
  short sStack_b86;
  short sStack_b84;
  short sStack_b82;
  short sStack_b80;
  short sStack_b7e;
  short sStack_b7c;
  short sStack_b7a;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  short local_b28;
  short sStack_b26;
  short sStack_b24;
  short sStack_b22;
  short sStack_b20;
  short sStack_b1e;
  short sStack_b1c;
  short sStack_b1a;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  short local_b08;
  short sStack_b06;
  short sStack_b04;
  short sStack_b02;
  short sStack_b00;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  short local_ab8;
  short sStack_ab6;
  short sStack_ab4;
  short sStack_ab2;
  short sStack_ab0;
  short sStack_aae;
  short sStack_aac;
  short sStack_aaa;
  short local_aa8;
  short sStack_aa6;
  short sStack_aa4;
  short sStack_aa2;
  short sStack_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  short local_a18;
  short sStack_a16;
  short sStack_a14;
  short sStack_a12;
  short sStack_a10;
  short sStack_a0e;
  short sStack_a0c;
  short sStack_a0a;
  short local_9f8;
  short sStack_9f6;
  short sStack_9f4;
  short sStack_9f2;
  short sStack_9f0;
  short sStack_9ee;
  short sStack_9ec;
  short sStack_9ea;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_998;
  short sStack_996;
  short sStack_994;
  short sStack_992;
  short sStack_990;
  short sStack_98e;
  short sStack_98c;
  short sStack_98a;
  short local_958;
  short sStack_956;
  short sStack_954;
  short sStack_952;
  short sStack_950;
  short sStack_94e;
  short sStack_94c;
  short sStack_94a;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short sStack_91e;
  short sStack_91c;
  short sStack_91a;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  short local_8e8;
  short sStack_8e6;
  short sStack_8e4;
  short sStack_8e2;
  short sStack_8e0;
  short sStack_8de;
  short sStack_8dc;
  short sStack_8da;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8c0;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_778;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_770;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_720;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  short local_718;
  short sStack_716;
  short sStack_714;
  short sStack_712;
  short sStack_710;
  short sStack_70e;
  short sStack_70c;
  short sStack_70a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_6d0;
  short sStack_6ce;
  short sStack_6cc;
  short sStack_6ca;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_690;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short local_638;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short sStack_630;
  short sStack_62e;
  short sStack_62c;
  short sStack_62a;
  short local_618;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short sStack_610;
  short sStack_60e;
  short sStack_60c;
  short sStack_60a;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short local_5d8;
  short sStack_5d6;
  short sStack_5d4;
  short sStack_5d2;
  short sStack_5d0;
  short sStack_5ce;
  short sStack_5cc;
  short sStack_5ca;
  short local_5b8;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short sStack_5b0;
  short sStack_5ae;
  short sStack_5ac;
  short sStack_5aa;
  short local_598;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_590;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short local_578;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_570;
  short sStack_56e;
  short sStack_56c;
  short sStack_56a;
  short local_558;
  short sStack_556;
  short sStack_554;
  short sStack_552;
  short sStack_550;
  short sStack_54e;
  short sStack_54c;
  short sStack_54a;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  short local_4d8;
  short sStack_4d6;
  short sStack_4d4;
  short sStack_4d2;
  short sStack_4d0;
  short sStack_4ce;
  short sStack_4cc;
  short sStack_4ca;
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  int bd_00;
  
  x6 = (__m128i *)&stack0xffffffffffffe3e8;
  x7 = (__m128i *)&stack0xffffffffffffe3e8;
  local_1340 = in_RDI + -2;
  local_19c8 = *local_1340;
  uStack_19c0 = in_RDI[-1];
  local_1348 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2 + -0x10);
  local_19d8 = *local_1348;
  uStack_19d0 = local_1348[1];
  local_1350 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * 2 + -0x10);
  local_19e8 = *local_1350;
  uStack_19e0 = local_1350[1];
  local_1358 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * 2 + -0x10);
  local_19f8 = *local_1358;
  uStack_19f0 = local_1358[1];
  local_1360 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 2) * 2 + -0x10);
  local_1a08 = *local_1360;
  uStack_1a00 = local_1360[1];
  local_1368 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 5) * 2 + -0x10);
  local_1a18 = *local_1368;
  uStack_1a10 = local_1368[1];
  local_1370 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 6) * 2 + -0x10);
  local_1a28 = *local_1370;
  uStack_1a20 = local_1370[1];
  local_1378 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 7) * 2 + -0x10);
  local_1a38 = *local_1378;
  uStack_1a30 = local_1378[1];
  x1 = &local_19b8;
  local_18d0 = in_R9;
  local_18c8 = in_R8;
  local_18c0 = in_RCX;
  local_18b8 = in_RDX;
  local_18ac = in_ESI;
  local_18a8 = in_RDI;
  highbd_transpose8x8_sse2
            (in_stack_ffffffffffffe438,x1,&local_19a8,&local_1998,&local_1988,(__m128i *)local_1978,
             (__m128i *)&stack0xffffffffffffe3e8,in_stack_ffffffffffffe468,x1,
             in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,in_stack_ffffffffffffe488,
             in_stack_ffffffffffffe490,in_stack_ffffffffffffe498,in_stack_ffffffffffffe4a0,
             in_stack_ffffffffffffe4a8);
  local_1380 = local_18a8;
  local_1a48 = *local_18a8;
  uStack_1a40 = local_18a8[1];
  local_1388 = (undefined8 *)((long)local_18a8 + (long)local_18ac * 2);
  local_1a58 = *local_1388;
  uStack_1a50 = local_1388[1];
  local_1390 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 2) * 2);
  local_1a68 = *local_1390;
  uStack_1a60 = local_1390[1];
  local_1398 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 3) * 2);
  local_1a78 = *local_1398;
  uStack_1a70 = local_1398[1];
  local_13a0 = (undefined8 *)((long)local_18a8 + (long)(local_18ac << 2) * 2);
  local_1a88 = *local_13a0;
  uStack_1a80 = local_13a0[1];
  local_13a8 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 5) * 2);
  local_1a98 = *local_13a8;
  uStack_1a90 = local_13a8[1];
  local_13b0 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 6) * 2);
  local_1ab8 = *local_13b0;
  uStack_1ab0 = local_13b0[1];
  local_13b8 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 7) * 2);
  local_1aa8 = *local_13b8;
  uStack_1aa0 = local_13b8[1];
  palVar24 = &local_1918;
  d1 = (__m128i *)local_1948;
  highbd_transpose8x8_sse2
            (in_stack_ffffffffffffe438,(__m128i *)local_1ad8,(__m128i *)local_18e8,&local_18f8,
             &local_1908,palVar24,x6,(__m128i *)&stack0xffffffffffffe3e8,x1,d1,
             in_stack_ffffffffffffe480,in_stack_ffffffffffffe488,in_stack_ffffffffffffe490,
             in_stack_ffffffffffffe498,in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe4a8);
  local_15d0 = local_18b8;
  local_15d8 = local_18c0;
  local_15e0 = local_18c8;
  local_15e8 = local_18d0;
  local_15fc = in_stack_00000018;
  local_1338 = 0;
  uStack_1330 = 0;
  local_1658 = 0;
  uStack_1650 = 0;
  t80_out = &local_1648;
  thr_out = &local_1638;
  lt_out = &local_1628;
  palVar23 = (__m128i *)local_1618;
  l = lt_out;
  bl = palVar23;
  th = t80_out;
  qs_00 = thr_out;
  local_15c8 = d1;
  local_15c0 = x1;
  get_limit_dual(local_18b8,local_18c0,local_18c8,local_18d0,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018,palVar23,lt_out,thr_out,t80_out);
  bd_00 = (int)((ulong)palVar23 >> 0x20);
  palVar23 = (__m128i *)&local_1668;
  highbd_filter_mask_dual(local_15c0,local_15c8,l,bl,palVar23);
  highbd_flat_mask4_dual_sse2(palVar24,t80_out,thr_out,lt_out,bd_00);
  local_1678 = local_1678 & local_1668;
  uStack_1670 = uStack_1670 & uStack_1660;
  local_1688 = local_1688 & local_1678;
  uStack_1680 = uStack_1680 & uStack_1670;
  highbd_filter4_dual_sse2
            (in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,qs_00,
             palVar23,th,in_stack_ffffffffffffedb0,in_stack_ffffffffffffedb8);
  palVar24 = local_15c0;
  local_1198 = (short)local_1678;
  sStack_1196 = (short)(local_1678 >> 0x10);
  sStack_1194 = (short)(local_1678 >> 0x20);
  sStack_1192 = (short)(local_1678 >> 0x30);
  sStack_1190 = (short)uStack_1670;
  sStack_118e = (short)(uStack_1670 >> 0x10);
  sStack_118c = (short)(uStack_1670 >> 0x20);
  sStack_118a = (short)(uStack_1670 >> 0x30);
  local_11a8 = (short)local_1658;
  sStack_11a6 = (short)((ulong)local_1658 >> 0x10);
  sStack_11a4 = (short)((ulong)local_1658 >> 0x20);
  sStack_11a2 = (short)((ulong)local_1658 >> 0x30);
  sStack_11a0 = (short)uStack_1650;
  sStack_119e = (short)((ulong)uStack_1650 >> 0x10);
  sStack_119c = (short)((ulong)uStack_1650 >> 0x20);
  sStack_119a = (short)((ulong)uStack_1650 >> 0x30);
  uVar21 = -(ushort)(sStack_118a == sStack_119a);
  auVar9._2_2_ = -(ushort)(sStack_1196 == sStack_11a6);
  auVar9._0_2_ = -(ushort)(local_1198 == local_11a8);
  auVar9._4_2_ = -(ushort)(sStack_1194 == sStack_11a4);
  auVar9._6_2_ = -(ushort)(sStack_1192 == sStack_11a2);
  auVar9._8_2_ = -(ushort)(sStack_1190 == sStack_11a0);
  auVar9._10_2_ = -(ushort)(sStack_118e == sStack_119e);
  auVar9._12_2_ = -(ushort)(sStack_118c == sStack_119c);
  auVar9._14_2_ = uVar21;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uVar21 >> 7) & 1) << 0xe | uVar21 & 0x8000) == 0xffff) {
    (*local_15c0)[0] = local_16a8[0];
    (*palVar24)[1] = local_16a8[1];
    palVar24 = local_15c8;
    (*local_15c8)[0] = local_16c8;
    (*palVar24)[1] = uStack_16c0;
    palVar24 = local_15c0;
    local_15c0[1][0] = local_16a8[2];
    palVar24[1][1] = local_16a8[3];
    palVar24 = local_15c8;
    local_15c8[1][0] = local_16b8;
    palVar24[1][1] = lStack_16b0;
  }
  else {
    local_17f8 = 0x8000800080008;
    uStack_17f0 = 0x8000800080008;
    local_1808 = 0x4000400040004;
    uStack_1800 = 0x4000400040004;
    lVar1 = local_15c0[3][0];
    lVar2 = local_15c0[3][1];
    lVar3 = local_15c0[4][0];
    lVar4 = local_15c0[4][1];
    lVar5 = local_15c0[5][0];
    lVar6 = local_15c0[5][1];
    local_688 = (short)lVar3;
    sStack_686 = (short)((ulong)lVar3 >> 0x10);
    sStack_684 = (short)((ulong)lVar3 >> 0x20);
    sStack_682 = (short)((ulong)lVar3 >> 0x30);
    sStack_680 = (short)lVar4;
    sStack_67e = (short)((ulong)lVar4 >> 0x10);
    sStack_67c = (short)((ulong)lVar4 >> 0x20);
    sStack_67a = (short)((ulong)lVar4 >> 0x30);
    local_698 = (short)lVar1;
    sStack_696 = (short)((ulong)lVar1 >> 0x10);
    sStack_694 = (short)((ulong)lVar1 >> 0x20);
    sStack_692 = (short)((ulong)lVar1 >> 0x30);
    sStack_690 = (short)lVar2;
    sStack_68e = (short)((ulong)lVar2 >> 0x10);
    sStack_68c = (short)((ulong)lVar2 >> 0x20);
    sStack_68a = (short)((ulong)lVar2 >> 0x30);
    local_6a8 = (short)lVar5;
    sStack_6a6 = (short)((ulong)lVar5 >> 0x10);
    sStack_6a4 = (short)((ulong)lVar5 >> 0x20);
    sStack_6a2 = (short)((ulong)lVar5 >> 0x30);
    sStack_6a0 = (short)lVar6;
    sStack_69e = (short)((ulong)lVar6 >> 0x10);
    sStack_69c = (short)((ulong)lVar6 >> 0x20);
    sStack_69a = (short)((ulong)lVar6 >> 0x30);
    lVar1 = local_15c8[3][0];
    lVar2 = local_15c8[3][1];
    lVar3 = local_15c8[4][0];
    lVar4 = local_15c8[4][1];
    lVar5 = local_15c8[5][0];
    lVar6 = local_15c8[5][1];
    local_6c8 = (short)lVar3;
    sStack_6c6 = (short)((ulong)lVar3 >> 0x10);
    sStack_6c4 = (short)((ulong)lVar3 >> 0x20);
    sStack_6c2 = (short)((ulong)lVar3 >> 0x30);
    sStack_6c0 = (short)lVar4;
    sStack_6be = (short)((ulong)lVar4 >> 0x10);
    sStack_6bc = (short)((ulong)lVar4 >> 0x20);
    sStack_6ba = (short)((ulong)lVar4 >> 0x30);
    local_6d8 = (short)lVar1;
    sStack_6d6 = (short)((ulong)lVar1 >> 0x10);
    sStack_6d4 = (short)((ulong)lVar1 >> 0x20);
    sStack_6d2 = (short)((ulong)lVar1 >> 0x30);
    sStack_6d0 = (short)lVar2;
    sStack_6ce = (short)((ulong)lVar2 >> 0x10);
    sStack_6cc = (short)((ulong)lVar2 >> 0x20);
    sStack_6ca = (short)((ulong)lVar2 >> 0x30);
    local_6e8 = (short)lVar5;
    sStack_6e6 = (short)((ulong)lVar5 >> 0x10);
    sStack_6e4 = (short)((ulong)lVar5 >> 0x20);
    sStack_6e2 = (short)((ulong)lVar5 >> 0x30);
    sStack_6e0 = (short)lVar6;
    sStack_6de = (short)((ulong)lVar6 >> 0x10);
    sStack_6dc = (short)((ulong)lVar6 >> 0x20);
    sStack_6da = (short)((ulong)lVar6 >> 0x30);
    lVar1 = (*local_15c0)[0];
    lVar2 = (*local_15c0)[1];
    lVar3 = local_15c0[1][0];
    lVar4 = local_15c0[1][1];
    lVar5 = local_15c0[2][0];
    lVar6 = local_15c0[2][1];
    local_708 = (short)lVar5;
    sStack_706 = (short)((ulong)lVar5 >> 0x10);
    sStack_704 = (short)((ulong)lVar5 >> 0x20);
    sStack_702 = (short)((ulong)lVar5 >> 0x30);
    sStack_700 = (short)lVar6;
    sStack_6fe = (short)((ulong)lVar6 >> 0x10);
    sStack_6fc = (short)((ulong)lVar6 >> 0x20);
    sStack_6fa = (short)((ulong)lVar6 >> 0x30);
    local_718 = (short)lVar3;
    sStack_716 = (short)((ulong)lVar3 >> 0x10);
    sStack_714 = (short)((ulong)lVar3 >> 0x20);
    sStack_712 = (short)((ulong)lVar3 >> 0x30);
    sStack_710 = (short)lVar4;
    sStack_70e = (short)((ulong)lVar4 >> 0x10);
    sStack_70c = (short)((ulong)lVar4 >> 0x20);
    sStack_70a = (short)((ulong)lVar4 >> 0x30);
    local_728 = (short)lVar1;
    sStack_726 = (short)((ulong)lVar1 >> 0x10);
    sStack_724 = (short)((ulong)lVar1 >> 0x20);
    sStack_722 = (short)((ulong)lVar1 >> 0x30);
    sStack_720 = (short)lVar2;
    sStack_71e = (short)((ulong)lVar2 >> 0x10);
    sStack_71c = (short)((ulong)lVar2 >> 0x20);
    sStack_71a = (short)((ulong)lVar2 >> 0x30);
    local_728 = local_728 + local_708 + local_718;
    sStack_726 = sStack_726 + sStack_706 + sStack_716;
    sStack_724 = sStack_724 + sStack_704 + sStack_714;
    sStack_722 = sStack_722 + sStack_702 + sStack_712;
    sStack_720 = sStack_720 + sStack_700 + sStack_710;
    sStack_71e = sStack_71e + sStack_6fe + sStack_70e;
    sStack_71c = sStack_71c + sStack_6fc + sStack_70c;
    sStack_71a = sStack_71a + sStack_6fa + sStack_70a;
    lVar1 = (*local_15c8)[0];
    lVar2 = (*local_15c8)[1];
    lVar3 = local_15c8[1][0];
    lVar4 = local_15c8[1][1];
    lVar5 = local_15c8[2][0];
    lVar6 = local_15c8[2][1];
    local_768 = (short)lVar5;
    sStack_766 = (short)((ulong)lVar5 >> 0x10);
    sStack_764 = (short)((ulong)lVar5 >> 0x20);
    sStack_762 = (short)((ulong)lVar5 >> 0x30);
    sStack_760 = (short)lVar6;
    sStack_75e = (short)((ulong)lVar6 >> 0x10);
    sStack_75c = (short)((ulong)lVar6 >> 0x20);
    sStack_75a = (short)((ulong)lVar6 >> 0x30);
    local_778 = (short)lVar3;
    sStack_776 = (short)((ulong)lVar3 >> 0x10);
    sStack_774 = (short)((ulong)lVar3 >> 0x20);
    sStack_772 = (short)((ulong)lVar3 >> 0x30);
    sStack_770 = (short)lVar4;
    sStack_76e = (short)((ulong)lVar4 >> 0x10);
    sStack_76c = (short)((ulong)lVar4 >> 0x20);
    sStack_76a = (short)((ulong)lVar4 >> 0x30);
    local_788 = (short)lVar1;
    sStack_786 = (short)((ulong)lVar1 >> 0x10);
    sStack_784 = (short)((ulong)lVar1 >> 0x20);
    sStack_782 = (short)((ulong)lVar1 >> 0x30);
    sStack_780 = (short)lVar2;
    sStack_77e = (short)((ulong)lVar2 >> 0x10);
    sStack_77c = (short)((ulong)lVar2 >> 0x20);
    sStack_77a = (short)((ulong)lVar2 >> 0x30);
    local_788 = local_788 + local_768 + local_778;
    sStack_786 = sStack_786 + sStack_766 + sStack_776;
    sStack_784 = sStack_784 + sStack_764 + sStack_774;
    sStack_782 = sStack_782 + sStack_762 + sStack_772;
    sStack_780 = sStack_780 + sStack_760 + sStack_770;
    sStack_77e = sStack_77e + sStack_75e + sStack_76e;
    sStack_77c = sStack_77c + sStack_75c + sStack_76c;
    sStack_77a = sStack_77a + sStack_75a + sStack_76a;
    local_1818 = local_6a8 + local_688 + local_698 + local_728 +
                 local_6e8 + local_6c8 + local_6d8 + local_788 + 8;
    sStack_1816 = sStack_6a6 + sStack_686 + sStack_696 + sStack_726 +
                  sStack_6e6 + sStack_6c6 + sStack_6d6 + sStack_786 + 8;
    sStack_1814 = sStack_6a4 + sStack_684 + sStack_694 + sStack_724 +
                  sStack_6e4 + sStack_6c4 + sStack_6d4 + sStack_784 + 8;
    sStack_1812 = sStack_6a2 + sStack_682 + sStack_692 + sStack_722 +
                  sStack_6e2 + sStack_6c2 + sStack_6d2 + sStack_782 + 8;
    sStack_1810 = sStack_6a0 + sStack_680 + sStack_690 + sStack_720 +
                  sStack_6e0 + sStack_6c0 + sStack_6d0 + sStack_780 + 8;
    sStack_180e = sStack_69e + sStack_67e + sStack_68e + sStack_71e +
                  sStack_6de + sStack_6be + sStack_6ce + sStack_77e + 8;
    sStack_180c = sStack_69c + sStack_67c + sStack_68c + sStack_71c +
                  sStack_6dc + sStack_6bc + sStack_6cc + sStack_77c + 8;
    sStack_180a = sStack_69a + sStack_67a + sStack_68a + sStack_71a +
                  sStack_6da + sStack_6ba + sStack_6ca + sStack_77a + 8;
    sVar13 = local_728 + local_788 + 4;
    sVar14 = sStack_726 + sStack_786 + 4;
    sVar15 = sStack_724 + sStack_784 + 4;
    sVar16 = sStack_722 + sStack_782 + 4;
    sVar17 = sStack_720 + sStack_780 + 4;
    sVar19 = sStack_71e + sStack_77e + 4;
    sVar20 = sStack_71c + sStack_77c + 4;
    sVar22 = sStack_71a + sStack_77a + 4;
    lVar1 = (*local_15c0)[0];
    lVar2 = (*local_15c0)[1];
    lVar3 = local_15c0[3][0];
    lVar4 = local_15c0[3][1];
    local_848 = (short)lVar3;
    sStack_846 = (short)((ulong)lVar3 >> 0x10);
    sStack_844 = (short)((ulong)lVar3 >> 0x20);
    sStack_842 = (short)((ulong)lVar3 >> 0x30);
    sStack_840 = (short)lVar4;
    sStack_83e = (short)((ulong)lVar4 >> 0x10);
    sStack_83c = (short)((ulong)lVar4 >> 0x20);
    sStack_83a = (short)((ulong)lVar4 >> 0x30);
    local_858 = (short)lVar1;
    sStack_856 = (short)((ulong)lVar1 >> 0x10);
    sStack_854 = (short)((ulong)lVar1 >> 0x20);
    sStack_852 = (short)((ulong)lVar1 >> 0x30);
    sStack_850 = (short)lVar2;
    sStack_84e = (short)((ulong)lVar2 >> 0x10);
    sStack_84c = (short)((ulong)lVar2 >> 0x20);
    sStack_84a = (short)((ulong)lVar2 >> 0x30);
    local_16f8 = (ushort)(sVar13 + local_848 + local_858) >> 3;
    uStack_16f6 = (ushort)(sVar14 + sStack_846 + sStack_856) >> 3;
    uStack_16f4 = (ushort)(sVar15 + sStack_844 + sStack_854) >> 3;
    uStack_16f2 = (ushort)(sVar16 + sStack_842 + sStack_852) >> 3;
    uStack_16f0 = (ushort)(sVar17 + sStack_840 + sStack_850) >> 3;
    uStack_16ee = (ushort)(sVar19 + sStack_83e + sStack_84e) >> 3;
    uStack_16ec = (ushort)(sVar20 + sStack_83c + sStack_84c) >> 3;
    uStack_16ea = (ushort)(sVar22 + sStack_83a + sStack_84a) >> 3;
    lVar1 = (*local_15c8)[0];
    lVar2 = (*local_15c8)[1];
    lVar3 = local_15c8[3][0];
    lVar4 = local_15c8[3][1];
    local_888 = (short)lVar3;
    sStack_886 = (short)((ulong)lVar3 >> 0x10);
    sStack_884 = (short)((ulong)lVar3 >> 0x20);
    sStack_882 = (short)((ulong)lVar3 >> 0x30);
    sStack_880 = (short)lVar4;
    sStack_87e = (short)((ulong)lVar4 >> 0x10);
    sStack_87c = (short)((ulong)lVar4 >> 0x20);
    sStack_87a = (short)((ulong)lVar4 >> 0x30);
    local_898 = (short)lVar1;
    sStack_896 = (short)((ulong)lVar1 >> 0x10);
    sStack_894 = (short)((ulong)lVar1 >> 0x20);
    sStack_892 = (short)((ulong)lVar1 >> 0x30);
    sStack_890 = (short)lVar2;
    sStack_88e = (short)((ulong)lVar2 >> 0x10);
    sStack_88c = (short)((ulong)lVar2 >> 0x20);
    sStack_88a = (short)((ulong)lVar2 >> 0x30);
    local_1728 = (ushort)(sVar13 + local_888 + local_898) >> 3;
    uStack_1726 = (ushort)(sVar14 + sStack_886 + sStack_896) >> 3;
    uStack_1724 = (ushort)(sVar15 + sStack_884 + sStack_894) >> 3;
    uStack_1722 = (ushort)(sVar16 + sStack_882 + sStack_892) >> 3;
    uStack_1720 = (ushort)(sVar17 + sStack_880 + sStack_890) >> 3;
    uStack_171e = (ushort)(sVar19 + sStack_87e + sStack_88e) >> 3;
    uStack_171c = (ushort)(sVar20 + sStack_87c + sStack_88c) >> 3;
    uStack_171a = (ushort)(sVar22 + sStack_87a + sStack_88a) >> 3;
    lVar1 = local_15c0[6][0];
    lVar2 = local_15c0[6][1];
    local_8c8 = (short)lVar1;
    sStack_8c6 = (short)((ulong)lVar1 >> 0x10);
    sStack_8c4 = (short)((ulong)lVar1 >> 0x20);
    sStack_8c2 = (short)((ulong)lVar1 >> 0x30);
    sStack_8c0 = (short)lVar2;
    sStack_8be = (short)((ulong)lVar2 >> 0x10);
    sStack_8bc = (short)((ulong)lVar2 >> 0x20);
    sStack_8ba = (short)((ulong)lVar2 >> 0x30);
    local_1858 = local_8c8 * 2;
    sStack_1856 = sStack_8c6 * 2;
    sStack_1854 = sStack_8c4 * 2;
    sStack_1852 = sStack_8c2 * 2;
    sStack_1850 = sStack_8c0 * 2;
    sStack_184e = sStack_8be * 2;
    sStack_184c = sStack_8bc * 2;
    sStack_184a = sStack_8ba * 2;
    lVar1 = local_15c8[6][0];
    lVar2 = local_15c8[6][1];
    local_8e8 = (short)lVar1;
    sStack_8e6 = (short)((ulong)lVar1 >> 0x10);
    sStack_8e4 = (short)((ulong)lVar1 >> 0x20);
    sStack_8e2 = (short)((ulong)lVar1 >> 0x30);
    sStack_8e0 = (short)lVar2;
    sStack_8de = (short)((ulong)lVar2 >> 0x10);
    sStack_8dc = (short)((ulong)lVar2 >> 0x20);
    sStack_8da = (short)((ulong)lVar2 >> 0x30);
    local_1868 = local_8e8 * 2;
    sStack_1866 = sStack_8e6 * 2;
    sStack_1864 = sStack_8e4 * 2;
    sStack_1862 = sStack_8e2 * 2;
    sStack_1860 = sStack_8e0 * 2;
    sStack_185e = sStack_8de * 2;
    sStack_185c = sStack_8dc * 2;
    sStack_185a = sStack_8da * 2;
    lVar1 = local_15c0[3][0];
    lVar2 = local_15c0[3][1];
    local_908 = (short)lVar1;
    sStack_906 = (short)((ulong)lVar1 >> 0x10);
    sStack_904 = (short)((ulong)lVar1 >> 0x20);
    sStack_902 = (short)((ulong)lVar1 >> 0x30);
    sStack_900 = (short)lVar2;
    sStack_8fe = (short)((ulong)lVar2 >> 0x10);
    sStack_8fc = (short)((ulong)lVar2 >> 0x20);
    sStack_8fa = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_15c8[3][0];
    lVar2 = local_15c8[3][1];
    local_928 = (short)lVar1;
    sStack_926 = (short)((ulong)lVar1 >> 0x10);
    sStack_924 = (short)((ulong)lVar1 >> 0x20);
    sStack_922 = (short)((ulong)lVar1 >> 0x30);
    sStack_920 = (short)lVar2;
    sStack_91e = (short)((ulong)lVar2 >> 0x10);
    sStack_91c = (short)((ulong)lVar2 >> 0x20);
    sStack_91a = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_15c0[5][0];
    lVar2 = local_15c0[5][1];
    local_4d8 = (short)lVar1;
    sStack_4d6 = (short)((ulong)lVar1 >> 0x10);
    sStack_4d4 = (short)((ulong)lVar1 >> 0x20);
    sStack_4d2 = (short)((ulong)lVar1 >> 0x30);
    sStack_4d0 = (short)lVar2;
    sStack_4ce = (short)((ulong)lVar2 >> 0x10);
    sStack_4cc = (short)((ulong)lVar2 >> 0x20);
    sStack_4ca = (short)((ulong)lVar2 >> 0x30);
    local_1828 = local_1818 - local_4d8;
    sStack_1826 = sStack_1816 - sStack_4d6;
    sStack_1824 = sStack_1814 - sStack_4d4;
    sStack_1822 = sStack_1812 - sStack_4d2;
    sStack_1820 = sStack_1810 - sStack_4d0;
    sStack_181e = sStack_180e - sStack_4ce;
    sStack_181c = sStack_180c - sStack_4cc;
    sStack_181a = sStack_180a - sStack_4ca;
    lVar1 = local_15c8[5][0];
    lVar2 = local_15c8[5][1];
    local_4f8 = (short)lVar1;
    sStack_4f6 = (short)((ulong)lVar1 >> 0x10);
    sStack_4f4 = (short)((ulong)lVar1 >> 0x20);
    sStack_4f2 = (short)((ulong)lVar1 >> 0x30);
    sStack_4f0 = (short)lVar2;
    sStack_4ee = (short)((ulong)lVar2 >> 0x10);
    sStack_4ec = (short)((ulong)lVar2 >> 0x20);
    sStack_4ea = (short)((ulong)lVar2 >> 0x30);
    local_1898 = local_1818 - local_4f8;
    sStack_1896 = sStack_1816 - sStack_4f6;
    sStack_1894 = sStack_1814 - sStack_4f4;
    sStack_1892 = sStack_1812 - sStack_4f2;
    sStack_1890 = sStack_1810 - sStack_4f0;
    sStack_188e = sStack_180e - sStack_4ee;
    sStack_188c = sStack_180c - sStack_4ec;
    sStack_188a = sStack_180a - sStack_4ea;
    lVar1 = local_15c0[2][0];
    lVar2 = local_15c0[2][1];
    local_518 = (short)lVar1;
    sStack_516 = (short)((ulong)lVar1 >> 0x10);
    sStack_514 = (short)((ulong)lVar1 >> 0x20);
    sStack_512 = (short)((ulong)lVar1 >> 0x30);
    sStack_510 = (short)lVar2;
    sStack_50e = (short)((ulong)lVar2 >> 0x10);
    sStack_50c = (short)((ulong)lVar2 >> 0x20);
    sStack_50a = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_15c8[2][0];
    lVar2 = local_15c8[2][1];
    local_538 = (short)lVar1;
    sStack_536 = (short)((ulong)lVar1 >> 0x10);
    sStack_534 = (short)((ulong)lVar1 >> 0x20);
    sStack_532 = (short)((ulong)lVar1 >> 0x30);
    sStack_530 = (short)lVar2;
    sStack_52e = (short)((ulong)lVar2 >> 0x10);
    sStack_52c = (short)((ulong)lVar2 >> 0x20);
    sStack_52a = (short)((ulong)lVar2 >> 0x30);
    lVar1 = local_15c0[1][0];
    lVar2 = local_15c0[1][1];
    local_958 = (short)lVar1;
    sStack_956 = (short)((ulong)lVar1 >> 0x10);
    sStack_954 = (short)((ulong)lVar1 >> 0x20);
    sStack_952 = (short)((ulong)lVar1 >> 0x30);
    sStack_950 = (short)lVar2;
    sStack_94e = (short)((ulong)lVar2 >> 0x10);
    sStack_94c = (short)((ulong)lVar2 >> 0x20);
    sStack_94a = (short)((ulong)lVar2 >> 0x30);
    local_16e8 = (ushort)((sVar13 - local_538) + local_908 * 2 + local_958) >> 3;
    uStack_16e6 = (ushort)((sVar14 - sStack_536) + sStack_906 * 2 + sStack_956) >> 3;
    uStack_16e4 = (ushort)((sVar15 - sStack_534) + sStack_904 * 2 + sStack_954) >> 3;
    uStack_16e2 = (ushort)((sVar16 - sStack_532) + sStack_902 * 2 + sStack_952) >> 3;
    uStack_16e0 = (ushort)((sVar17 - sStack_530) + sStack_900 * 2 + sStack_950) >> 3;
    uStack_16de = (ushort)((sVar19 - sStack_52e) + sStack_8fe * 2 + sStack_94e) >> 3;
    uStack_16dc = (ushort)((sVar20 - sStack_52c) + sStack_8fc * 2 + sStack_94c) >> 3;
    uStack_16da = (ushort)((sVar22 - sStack_52a) + sStack_8fa * 2 + sStack_94a) >> 3;
    lVar1 = local_15c8[1][0];
    lVar2 = local_15c8[1][1];
    local_998 = (short)lVar1;
    sStack_996 = (short)((ulong)lVar1 >> 0x10);
    sStack_994 = (short)((ulong)lVar1 >> 0x20);
    sStack_992 = (short)((ulong)lVar1 >> 0x30);
    sStack_990 = (short)lVar2;
    sStack_98e = (short)((ulong)lVar2 >> 0x10);
    sStack_98c = (short)((ulong)lVar2 >> 0x20);
    sStack_98a = (short)((ulong)lVar2 >> 0x30);
    local_1718 = (ushort)((sVar13 - local_518) + local_928 * 2 + local_998) >> 3;
    uStack_1716 = (ushort)((sVar14 - sStack_516) + sStack_926 * 2 + sStack_996) >> 3;
    uStack_1714 = (ushort)((sVar15 - sStack_514) + sStack_924 * 2 + sStack_994) >> 3;
    uStack_1712 = (ushort)((sVar16 - sStack_512) + sStack_922 * 2 + sStack_992) >> 3;
    uStack_1710 = (ushort)((sVar17 - sStack_510) + sStack_920 * 2 + sStack_990) >> 3;
    uStack_170e = (ushort)((sVar19 - sStack_50e) + sStack_91e * 2 + sStack_98e) >> 3;
    uStack_170c = (ushort)((sVar20 - sStack_50c) + sStack_91c * 2 + sStack_98c) >> 3;
    uStack_170a = (ushort)((sVar22 - sStack_50a) + sStack_91a * 2 + sStack_98a) >> 3;
    lVar1 = local_15c8[1][0];
    lVar2 = local_15c8[1][1];
    local_558 = (short)lVar1;
    sStack_556 = (short)((ulong)lVar1 >> 0x10);
    sStack_554 = (short)((ulong)lVar1 >> 0x20);
    sStack_552 = (short)((ulong)lVar1 >> 0x30);
    sStack_550 = (short)lVar2;
    sStack_54e = (short)((ulong)lVar2 >> 0x10);
    sStack_54c = (short)((ulong)lVar2 >> 0x20);
    sStack_54a = (short)((ulong)lVar2 >> 0x30);
    local_1838 = (sVar13 - local_538) - local_558;
    sStack_1836 = (sVar14 - sStack_536) - sStack_556;
    sStack_1834 = (sVar15 - sStack_534) - sStack_554;
    sStack_1832 = (sVar16 - sStack_532) - sStack_552;
    sStack_1830 = (sVar17 - sStack_530) - sStack_550;
    sStack_182e = (sVar19 - sStack_52e) - sStack_54e;
    sStack_182c = (sVar20 - sStack_52c) - sStack_54c;
    sStack_182a = (sVar22 - sStack_52a) - sStack_54a;
    lVar1 = local_15c0[1][0];
    lVar2 = local_15c0[1][1];
    local_578 = (short)lVar1;
    sStack_576 = (short)((ulong)lVar1 >> 0x10);
    sStack_574 = (short)((ulong)lVar1 >> 0x20);
    sStack_572 = (short)((ulong)lVar1 >> 0x30);
    sStack_570 = (short)lVar2;
    sStack_56e = (short)((ulong)lVar2 >> 0x10);
    sStack_56c = (short)((ulong)lVar2 >> 0x20);
    sStack_56a = (short)((ulong)lVar2 >> 0x30);
    local_1848 = (sVar13 - local_518) - local_578;
    sStack_1846 = (sVar14 - sStack_516) - sStack_576;
    sStack_1844 = (sVar15 - sStack_514) - sStack_574;
    sStack_1842 = (sVar16 - sStack_512) - sStack_572;
    sStack_1840 = (sVar17 - sStack_510) - sStack_570;
    sStack_183e = (sVar19 - sStack_50e) - sStack_56e;
    sStack_183c = (sVar20 - sStack_50c) - sStack_56c;
    sStack_183a = (sVar22 - sStack_50a) - sStack_56a;
    lVar1 = local_15c0[3][0];
    lVar2 = local_15c0[3][1];
    local_9d8 = (short)lVar1;
    sStack_9d6 = (short)((ulong)lVar1 >> 0x10);
    sStack_9d4 = (short)((ulong)lVar1 >> 0x20);
    sStack_9d2 = (short)((ulong)lVar1 >> 0x30);
    sStack_9d0 = (short)lVar2;
    sStack_9ce = (short)((ulong)lVar2 >> 0x10);
    sStack_9cc = (short)((ulong)lVar2 >> 0x20);
    sStack_9ca = (short)((ulong)lVar2 >> 0x30);
    local_1878 = local_908 * 2 + local_9d8;
    sStack_1876 = sStack_906 * 2 + sStack_9d6;
    sStack_1874 = sStack_904 * 2 + sStack_9d4;
    sStack_1872 = sStack_902 * 2 + sStack_9d2;
    sStack_1870 = sStack_900 * 2 + sStack_9d0;
    sStack_186e = sStack_8fe * 2 + sStack_9ce;
    sStack_186c = sStack_8fc * 2 + sStack_9cc;
    sStack_186a = sStack_8fa * 2 + sStack_9ca;
    lVar1 = local_15c8[3][0];
    lVar2 = local_15c8[3][1];
    local_9f8 = (short)lVar1;
    sStack_9f6 = (short)((ulong)lVar1 >> 0x10);
    sStack_9f4 = (short)((ulong)lVar1 >> 0x20);
    sStack_9f2 = (short)((ulong)lVar1 >> 0x30);
    sStack_9f0 = (short)lVar2;
    sStack_9ee = (short)((ulong)lVar2 >> 0x10);
    sStack_9ec = (short)((ulong)lVar2 >> 0x20);
    sStack_9ea = (short)((ulong)lVar2 >> 0x30);
    local_1888 = local_928 * 2 + local_9f8;
    sStack_1886 = sStack_926 * 2 + sStack_9f6;
    sStack_1884 = sStack_924 * 2 + sStack_9f4;
    sStack_1882 = sStack_922 * 2 + sStack_9f2;
    sStack_1880 = sStack_920 * 2 + sStack_9f0;
    sStack_187e = sStack_91e * 2 + sStack_9ee;
    sStack_187c = sStack_91c * 2 + sStack_9ec;
    sStack_187a = sStack_91a * 2 + sStack_9ea;
    lVar1 = local_15c0[2][0];
    lVar2 = local_15c0[2][1];
    local_a18 = (short)lVar1;
    sStack_a16 = (short)((ulong)lVar1 >> 0x10);
    sStack_a14 = (short)((ulong)lVar1 >> 0x20);
    sStack_a12 = (short)((ulong)lVar1 >> 0x30);
    sStack_a10 = (short)lVar2;
    sStack_a0e = (short)((ulong)lVar2 >> 0x10);
    sStack_a0c = (short)((ulong)lVar2 >> 0x20);
    sStack_a0a = (short)((ulong)lVar2 >> 0x30);
    local_16d8 = CONCAT26((ushort)(sStack_1832 + sStack_1872 + sStack_a12) >> 3,
                          CONCAT24((ushort)(sStack_1834 + sStack_1874 + sStack_a14) >> 3,
                                   CONCAT22((ushort)(sStack_1836 + sStack_1876 + sStack_a16) >> 3,
                                            (ushort)(local_1838 + local_1878 + local_a18) >> 3)));
    uStack_16d0 = CONCAT26((ushort)(sStack_182a + sStack_186a + sStack_a0a) >> 3,
                           CONCAT24((ushort)(sStack_182c + sStack_186c + sStack_a0c) >> 3,
                                    CONCAT22((ushort)(sStack_182e + sStack_186e + sStack_a0e) >> 3,
                                             (ushort)(sStack_1830 + sStack_1870 + sStack_a10) >> 3))
                          );
    lVar1 = local_15c8[2][0];
    lVar2 = local_15c8[2][1];
    local_a58 = (short)lVar1;
    sStack_a56 = (short)((ulong)lVar1 >> 0x10);
    sStack_a54 = (short)((ulong)lVar1 >> 0x20);
    sStack_a52 = (short)((ulong)lVar1 >> 0x30);
    sStack_a50 = (short)lVar2;
    sStack_a4e = (short)((ulong)lVar2 >> 0x10);
    sStack_a4c = (short)((ulong)lVar2 >> 0x20);
    sStack_a4a = (short)((ulong)lVar2 >> 0x30);
    local_1708 = CONCAT26((ushort)(sStack_1842 + sStack_1882 + sStack_a52) >> 3,
                          CONCAT24((ushort)(sStack_1844 + sStack_1884 + sStack_a54) >> 3,
                                   CONCAT22((ushort)(sStack_1846 + sStack_1886 + sStack_a56) >> 3,
                                            (ushort)(local_1848 + local_1888 + local_a58) >> 3)));
    uStack_1700 = CONCAT26((ushort)(sStack_183a + sStack_187a + sStack_a4a) >> 3,
                           CONCAT24((ushort)(sStack_183c + sStack_187c + sStack_a4c) >> 3,
                                    CONCAT22((ushort)(sStack_183e + sStack_187e + sStack_a4e) >> 3,
                                             (ushort)(sStack_1840 + sStack_1880 + sStack_a50) >> 3))
                          );
    local_11b8 = (short)local_1688;
    sStack_11b6 = (short)(local_1688 >> 0x10);
    sStack_11b4 = (short)(local_1688 >> 0x20);
    sStack_11b2 = (short)(local_1688 >> 0x30);
    sStack_11b0 = (short)uStack_1680;
    sStack_11ae = (short)(uStack_1680 >> 0x10);
    sStack_11ac = (short)(uStack_1680 >> 0x20);
    sStack_11aa = (short)(uStack_1680 >> 0x30);
    uVar21 = -(ushort)(sStack_11aa == sStack_119a);
    auVar8._2_2_ = -(ushort)(sStack_11b6 == sStack_11a6);
    auVar8._0_2_ = -(ushort)(local_11b8 == local_11a8);
    auVar8._4_2_ = -(ushort)(sStack_11b4 == sStack_11a4);
    auVar8._6_2_ = -(ushort)(sStack_11b2 == sStack_11a2);
    auVar8._8_2_ = -(ushort)(sStack_11b0 == sStack_11a0);
    auVar8._10_2_ = -(ushort)(sStack_11ae == sStack_119e);
    auVar8._12_2_ = -(ushort)(sStack_11ac == sStack_119c);
    auVar8._14_2_ = uVar21;
    local_189c = (uint)((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(uVar21 >> 7) & 1) << 0xe | uVar21 & 0x8000) !=
                       0xffff);
    if (local_189c != 0) {
      lVar1 = local_15c0[6][0];
      lVar2 = local_15c0[6][1];
      lVar3 = (*local_15c0)[0];
      lVar4 = (*local_15c0)[1];
      local_a88 = (short)lVar1;
      sStack_a86 = (short)((ulong)lVar1 >> 0x10);
      sStack_a84 = (short)((ulong)lVar1 >> 0x20);
      sStack_a82 = (short)((ulong)lVar1 >> 0x30);
      sStack_a80 = (short)lVar2;
      sStack_a7e = (short)((ulong)lVar2 >> 0x10);
      sStack_a7c = (short)((ulong)lVar2 >> 0x20);
      sStack_a7a = (short)((ulong)lVar2 >> 0x30);
      local_a98 = (short)lVar3;
      sStack_a96 = (short)((ulong)lVar3 >> 0x10);
      sStack_a94 = (short)((ulong)lVar3 >> 0x20);
      sStack_a92 = (short)((ulong)lVar3 >> 0x30);
      sStack_a90 = (short)lVar4;
      sStack_a8e = (short)((ulong)lVar4 >> 0x10);
      sStack_a8c = (short)((ulong)lVar4 >> 0x20);
      sStack_a8a = (short)((ulong)lVar4 >> 0x30);
      lVar1 = local_15c0[1][0];
      lVar2 = local_15c0[1][1];
      lVar3 = (*local_15c8)[0];
      lVar4 = (*local_15c8)[1];
      local_aa8 = (short)lVar1;
      sStack_aa6 = (short)((ulong)lVar1 >> 0x10);
      sStack_aa4 = (short)((ulong)lVar1 >> 0x20);
      sStack_aa2 = (short)((ulong)lVar1 >> 0x30);
      sStack_aa0 = (short)lVar2;
      sStack_a9e = (short)((ulong)lVar2 >> 0x10);
      sStack_a9c = (short)((ulong)lVar2 >> 0x20);
      sStack_a9a = (short)((ulong)lVar2 >> 0x30);
      local_ab8 = (short)lVar3;
      sStack_ab6 = (short)((ulong)lVar3 >> 0x10);
      sStack_ab4 = (short)((ulong)lVar3 >> 0x20);
      sStack_ab2 = (short)((ulong)lVar3 >> 0x30);
      sStack_ab0 = (short)lVar4;
      sStack_aae = (short)((ulong)lVar4 >> 0x10);
      sStack_aac = (short)((ulong)lVar4 >> 0x20);
      sStack_aaa = (short)((ulong)lVar4 >> 0x30);
      local_1788._0_2_ = (ushort)(local_1818 + local_a88 + local_a98 + local_aa8 + local_ab8) >> 4;
      local_1788._2_2_ =
           (ushort)(sStack_1816 + sStack_a86 + sStack_a96 + sStack_aa6 + sStack_ab6) >> 4;
      local_1788._4_2_ =
           (ushort)(sStack_1814 + sStack_a84 + sStack_a94 + sStack_aa4 + sStack_ab4) >> 4;
      local_1788._6_2_ =
           (ushort)(sStack_1812 + sStack_a82 + sStack_a92 + sStack_aa2 + sStack_ab2) >> 4;
      uStack_1780._0_2_ =
           (ushort)(sStack_1810 + sStack_a80 + sStack_a90 + sStack_aa0 + sStack_ab0) >> 4;
      uStack_1780._2_2_ =
           (ushort)(sStack_180e + sStack_a7e + sStack_a8e + sStack_a9e + sStack_aae) >> 4;
      uStack_1780._4_2_ =
           (ushort)(sStack_180c + sStack_a7c + sStack_a8c + sStack_a9c + sStack_aac) >> 4;
      uStack_1780._6_2_ =
           (ushort)(sStack_180a + sStack_a7a + sStack_a8a + sStack_a9a + sStack_aaa) >> 4;
      lVar1 = local_15c8[6][0];
      lVar2 = local_15c8[6][1];
      lVar3 = (*local_15c8)[0];
      lVar4 = (*local_15c8)[1];
      local_b08 = (short)lVar1;
      sStack_b06 = (short)((ulong)lVar1 >> 0x10);
      sStack_b04 = (short)((ulong)lVar1 >> 0x20);
      sStack_b02 = (short)((ulong)lVar1 >> 0x30);
      sStack_b00 = (short)lVar2;
      sStack_afe = (short)((ulong)lVar2 >> 0x10);
      sStack_afc = (short)((ulong)lVar2 >> 0x20);
      sStack_afa = (short)((ulong)lVar2 >> 0x30);
      local_b18 = (short)lVar3;
      sStack_b16 = (short)((ulong)lVar3 >> 0x10);
      sStack_b14 = (short)((ulong)lVar3 >> 0x20);
      sStack_b12 = (short)((ulong)lVar3 >> 0x30);
      sStack_b10 = (short)lVar4;
      sStack_b0e = (short)((ulong)lVar4 >> 0x10);
      sStack_b0c = (short)((ulong)lVar4 >> 0x20);
      sStack_b0a = (short)((ulong)lVar4 >> 0x30);
      lVar1 = (*local_15c0)[0];
      lVar2 = (*local_15c0)[1];
      lVar3 = local_15c8[1][0];
      lVar4 = local_15c8[1][1];
      local_b28 = (short)lVar1;
      sStack_b26 = (short)((ulong)lVar1 >> 0x10);
      sStack_b24 = (short)((ulong)lVar1 >> 0x20);
      sStack_b22 = (short)((ulong)lVar1 >> 0x30);
      sStack_b20 = (short)lVar2;
      sStack_b1e = (short)((ulong)lVar2 >> 0x10);
      sStack_b1c = (short)((ulong)lVar2 >> 0x20);
      sStack_b1a = (short)((ulong)lVar2 >> 0x30);
      local_b38 = (short)lVar3;
      sStack_b36 = (short)((ulong)lVar3 >> 0x10);
      sStack_b34 = (short)((ulong)lVar3 >> 0x20);
      sStack_b32 = (short)((ulong)lVar3 >> 0x30);
      sStack_b30 = (short)lVar4;
      sStack_b2e = (short)((ulong)lVar4 >> 0x10);
      sStack_b2c = (short)((ulong)lVar4 >> 0x20);
      sStack_b2a = (short)((ulong)lVar4 >> 0x30);
      local_17e8._0_2_ = (ushort)(local_1818 + local_b08 + local_b18 + local_b28 + local_b38) >> 4;
      local_17e8._2_2_ =
           (ushort)(sStack_1816 + sStack_b06 + sStack_b16 + sStack_b26 + sStack_b36) >> 4;
      local_17e8._4_2_ =
           (ushort)(sStack_1814 + sStack_b04 + sStack_b14 + sStack_b24 + sStack_b34) >> 4;
      local_17e8._6_2_ =
           (ushort)(sStack_1812 + sStack_b02 + sStack_b12 + sStack_b22 + sStack_b32) >> 4;
      uStack_17e0._0_2_ =
           (ushort)(sStack_1810 + sStack_b00 + sStack_b10 + sStack_b20 + sStack_b30) >> 4;
      uStack_17e0._2_2_ =
           (ushort)(sStack_180e + sStack_afe + sStack_b0e + sStack_b1e + sStack_b2e) >> 4;
      uStack_17e0._4_2_ =
           (ushort)(sStack_180c + sStack_afc + sStack_b0c + sStack_b1c + sStack_b2c) >> 4;
      uStack_17e0._6_2_ =
           (ushort)(sStack_180a + sStack_afa + sStack_b0a + sStack_b1a + sStack_b2a) >> 4;
      lVar1 = local_15c0[1][0];
      lVar2 = local_15c0[1][1];
      lVar3 = local_15c0[2][0];
      lVar4 = local_15c0[2][1];
      lVar5 = (*local_15c0)[0];
      lVar6 = (*local_15c0)[1];
      local_b88 = (short)lVar3;
      sStack_b86 = (short)((ulong)lVar3 >> 0x10);
      sStack_b84 = (short)((ulong)lVar3 >> 0x20);
      sStack_b82 = (short)((ulong)lVar3 >> 0x30);
      sStack_b80 = (short)lVar4;
      sStack_b7e = (short)((ulong)lVar4 >> 0x10);
      sStack_b7c = (short)((ulong)lVar4 >> 0x20);
      sStack_b7a = (short)((ulong)lVar4 >> 0x30);
      local_b98 = (short)lVar5;
      sStack_b96 = (short)((ulong)lVar5 >> 0x10);
      sStack_b94 = (short)((ulong)lVar5 >> 0x20);
      sStack_b92 = (short)((ulong)lVar5 >> 0x30);
      sStack_b90 = (short)lVar6;
      sStack_b8e = (short)((ulong)lVar6 >> 0x10);
      sStack_b8c = (short)((ulong)lVar6 >> 0x20);
      sStack_b8a = (short)((ulong)lVar6 >> 0x30);
      local_ba8 = (short)lVar1;
      sStack_ba6 = (short)((ulong)lVar1 >> 0x10);
      sStack_ba4 = (short)((ulong)lVar1 >> 0x20);
      sStack_ba2 = (short)((ulong)lVar1 >> 0x30);
      sStack_ba0 = (short)lVar2;
      sStack_b9e = (short)((ulong)lVar2 >> 0x10);
      sStack_b9c = (short)((ulong)lVar2 >> 0x20);
      sStack_b9a = (short)((ulong)lVar2 >> 0x30);
      local_1778 = (ushort)(local_1898 + local_1858 + local_ba8 + local_b88 + local_b98) >> 4;
      uStack_1776 = (ushort)(sStack_1896 + sStack_1856 + sStack_ba6 + sStack_b86 + sStack_b96) >> 4;
      uStack_1774 = (ushort)(sStack_1894 + sStack_1854 + sStack_ba4 + sStack_b84 + sStack_b94) >> 4;
      uStack_1772 = (ushort)(sStack_1892 + sStack_1852 + sStack_ba2 + sStack_b82 + sStack_b92) >> 4;
      uStack_1770 = (ushort)(sStack_1890 + sStack_1850 + sStack_ba0 + sStack_b80 + sStack_b90) >> 4;
      uStack_176e = (ushort)(sStack_188e + sStack_184e + sStack_b9e + sStack_b7e + sStack_b8e) >> 4;
      uStack_176c = (ushort)(sStack_188c + sStack_184c + sStack_b9c + sStack_b7c + sStack_b8c) >> 4;
      uStack_176a = (ushort)(sStack_188a + sStack_184a + sStack_b9a + sStack_b7a + sStack_b8a) >> 4;
      lVar1 = local_15c8[1][0];
      lVar2 = local_15c8[1][1];
      lVar3 = (*local_15c8)[0];
      lVar4 = (*local_15c8)[1];
      lVar5 = local_15c8[2][0];
      lVar6 = local_15c8[2][1];
      local_c08 = (short)lVar3;
      sStack_c06 = (short)((ulong)lVar3 >> 0x10);
      sStack_c04 = (short)((ulong)lVar3 >> 0x20);
      sStack_c02 = (short)((ulong)lVar3 >> 0x30);
      sStack_c00 = (short)lVar4;
      sStack_bfe = (short)((ulong)lVar4 >> 0x10);
      sStack_bfc = (short)((ulong)lVar4 >> 0x20);
      sStack_bfa = (short)((ulong)lVar4 >> 0x30);
      local_c18 = (short)lVar5;
      sStack_c16 = (short)((ulong)lVar5 >> 0x10);
      sStack_c14 = (short)((ulong)lVar5 >> 0x20);
      sStack_c12 = (short)((ulong)lVar5 >> 0x30);
      sStack_c10 = (short)lVar6;
      sStack_c0e = (short)((ulong)lVar6 >> 0x10);
      sStack_c0c = (short)((ulong)lVar6 >> 0x20);
      sStack_c0a = (short)((ulong)lVar6 >> 0x30);
      local_c28 = (short)lVar1;
      sStack_c26 = (short)((ulong)lVar1 >> 0x10);
      sStack_c24 = (short)((ulong)lVar1 >> 0x20);
      sStack_c22 = (short)((ulong)lVar1 >> 0x30);
      sStack_c20 = (short)lVar2;
      sStack_c1e = (short)((ulong)lVar2 >> 0x10);
      sStack_c1c = (short)((ulong)lVar2 >> 0x20);
      sStack_c1a = (short)((ulong)lVar2 >> 0x30);
      local_17d8 = (ushort)(local_1828 + local_1868 + local_c28 + local_c08 + local_c18) >> 4;
      uStack_17d6 = (ushort)(sStack_1826 + sStack_1866 + sStack_c26 + sStack_c06 + sStack_c16) >> 4;
      uStack_17d4 = (ushort)(sStack_1824 + sStack_1864 + sStack_c24 + sStack_c04 + sStack_c14) >> 4;
      uStack_17d2 = (ushort)(sStack_1822 + sStack_1862 + sStack_c22 + sStack_c02 + sStack_c12) >> 4;
      uStack_17d0 = (ushort)(sStack_1820 + sStack_1860 + sStack_c20 + sStack_c00 + sStack_c10) >> 4;
      uStack_17ce = (ushort)(sStack_181e + sStack_185e + sStack_c1e + sStack_bfe + sStack_c0e) >> 4;
      uStack_17cc = (ushort)(sStack_181c + sStack_185c + sStack_c1c + sStack_bfc + sStack_c0c) >> 4;
      uStack_17ca = (ushort)(sStack_181a + sStack_185a + sStack_c1a + sStack_bfa + sStack_c0a) >> 4;
      lVar1 = local_15c0[6][0];
      lVar2 = local_15c0[6][1];
      local_c98 = (short)lVar1;
      sStack_c96 = (short)((ulong)lVar1 >> 0x10);
      sStack_c94 = (short)((ulong)lVar1 >> 0x20);
      sStack_c92 = (short)((ulong)lVar1 >> 0x30);
      sStack_c90 = (short)lVar2;
      sStack_c8e = (short)((ulong)lVar2 >> 0x10);
      sStack_c8c = (short)((ulong)lVar2 >> 0x20);
      sStack_c8a = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_15c8[6][0];
      lVar2 = local_15c8[6][1];
      local_cb8 = (short)lVar1;
      sStack_cb6 = (short)((ulong)lVar1 >> 0x10);
      sStack_cb4 = (short)((ulong)lVar1 >> 0x20);
      sStack_cb2 = (short)((ulong)lVar1 >> 0x30);
      sStack_cb0 = (short)lVar2;
      sStack_cae = (short)((ulong)lVar2 >> 0x10);
      sStack_cac = (short)((ulong)lVar2 >> 0x20);
      sStack_caa = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_15c8[4][0];
      lVar2 = local_15c8[4][1];
      local_598 = (short)lVar1;
      sStack_596 = (short)((ulong)lVar1 >> 0x10);
      sStack_594 = (short)((ulong)lVar1 >> 0x20);
      sStack_592 = (short)((ulong)lVar1 >> 0x30);
      sStack_590 = (short)lVar2;
      sStack_58e = (short)((ulong)lVar2 >> 0x10);
      sStack_58c = (short)((ulong)lVar2 >> 0x20);
      sStack_58a = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_15c0[4][0];
      lVar2 = local_15c0[4][1];
      local_5b8 = (short)lVar1;
      sStack_5b6 = (short)((ulong)lVar1 >> 0x10);
      sStack_5b4 = (short)((ulong)lVar1 >> 0x20);
      sStack_5b2 = (short)((ulong)lVar1 >> 0x30);
      sStack_5b0 = (short)lVar2;
      sStack_5ae = (short)((ulong)lVar2 >> 0x10);
      sStack_5ac = (short)((ulong)lVar2 >> 0x20);
      sStack_5aa = (short)((ulong)lVar2 >> 0x30);
      lVar1 = local_15c0[2][0];
      lVar2 = local_15c0[2][1];
      lVar3 = local_15c0[3][0];
      lVar4 = local_15c0[3][1];
      lVar5 = local_15c0[1][0];
      lVar6 = local_15c0[1][1];
      local_cc8 = (short)lVar3;
      sStack_cc6 = (short)((ulong)lVar3 >> 0x10);
      sStack_cc4 = (short)((ulong)lVar3 >> 0x20);
      sStack_cc2 = (short)((ulong)lVar3 >> 0x30);
      sStack_cc0 = (short)lVar4;
      sStack_cbe = (short)((ulong)lVar4 >> 0x10);
      sStack_cbc = (short)((ulong)lVar4 >> 0x20);
      sStack_cba = (short)((ulong)lVar4 >> 0x30);
      local_cd8 = (short)lVar5;
      sStack_cd6 = (short)((ulong)lVar5 >> 0x10);
      sStack_cd4 = (short)((ulong)lVar5 >> 0x20);
      sStack_cd2 = (short)((ulong)lVar5 >> 0x30);
      sStack_cd0 = (short)lVar6;
      sStack_cce = (short)((ulong)lVar6 >> 0x10);
      sStack_ccc = (short)((ulong)lVar6 >> 0x20);
      sStack_cca = (short)((ulong)lVar6 >> 0x30);
      local_ce8 = (short)lVar1;
      sStack_ce6 = (short)((ulong)lVar1 >> 0x10);
      sStack_ce4 = (short)((ulong)lVar1 >> 0x20);
      sStack_ce2 = (short)((ulong)lVar1 >> 0x30);
      sStack_ce0 = (short)lVar2;
      sStack_cde = (short)((ulong)lVar2 >> 0x10);
      sStack_cdc = (short)((ulong)lVar2 >> 0x20);
      sStack_cda = (short)((ulong)lVar2 >> 0x30);
      local_1768 = (ushort)((local_1898 - local_598) +
                           local_1858 + local_c98 + local_ce8 + local_cc8 + local_cd8) >> 4;
      uStack_1766 = (ushort)((sStack_1896 - sStack_596) +
                            sStack_1856 + sStack_c96 + sStack_ce6 + sStack_cc6 + sStack_cd6) >> 4;
      uStack_1764 = (ushort)((sStack_1894 - sStack_594) +
                            sStack_1854 + sStack_c94 + sStack_ce4 + sStack_cc4 + sStack_cd4) >> 4;
      uStack_1762 = (ushort)((sStack_1892 - sStack_592) +
                            sStack_1852 + sStack_c92 + sStack_ce2 + sStack_cc2 + sStack_cd2) >> 4;
      uStack_1760 = (ushort)((sStack_1890 - sStack_590) +
                            sStack_1850 + sStack_c90 + sStack_ce0 + sStack_cc0 + sStack_cd0) >> 4;
      uStack_175e = (ushort)((sStack_188e - sStack_58e) +
                            sStack_184e + sStack_c8e + sStack_cde + sStack_cbe + sStack_cce) >> 4;
      uStack_175c = (ushort)((sStack_188c - sStack_58c) +
                            sStack_184c + sStack_c8c + sStack_cdc + sStack_cbc + sStack_ccc) >> 4;
      uStack_175a = (ushort)((sStack_188a - sStack_58a) +
                            sStack_184a + sStack_c8a + sStack_cda + sStack_cba + sStack_cca) >> 4;
      lVar1 = local_15c8[2][0];
      lVar2 = local_15c8[2][1];
      lVar3 = local_15c8[1][0];
      lVar4 = local_15c8[1][1];
      lVar5 = local_15c8[3][0];
      lVar6 = local_15c8[3][1];
      local_d48 = (short)lVar3;
      sStack_d46 = (short)((ulong)lVar3 >> 0x10);
      sStack_d44 = (short)((ulong)lVar3 >> 0x20);
      sStack_d42 = (short)((ulong)lVar3 >> 0x30);
      sStack_d40 = (short)lVar4;
      sStack_d3e = (short)((ulong)lVar4 >> 0x10);
      sStack_d3c = (short)((ulong)lVar4 >> 0x20);
      sStack_d3a = (short)((ulong)lVar4 >> 0x30);
      local_d58 = (short)lVar5;
      sStack_d56 = (short)((ulong)lVar5 >> 0x10);
      sStack_d54 = (short)((ulong)lVar5 >> 0x20);
      sStack_d52 = (short)((ulong)lVar5 >> 0x30);
      sStack_d50 = (short)lVar6;
      sStack_d4e = (short)((ulong)lVar6 >> 0x10);
      sStack_d4c = (short)((ulong)lVar6 >> 0x20);
      sStack_d4a = (short)((ulong)lVar6 >> 0x30);
      local_d68 = (short)lVar1;
      sStack_d66 = (short)((ulong)lVar1 >> 0x10);
      sStack_d64 = (short)((ulong)lVar1 >> 0x20);
      sStack_d62 = (short)((ulong)lVar1 >> 0x30);
      sStack_d60 = (short)lVar2;
      sStack_d5e = (short)((ulong)lVar2 >> 0x10);
      sStack_d5c = (short)((ulong)lVar2 >> 0x20);
      sStack_d5a = (short)((ulong)lVar2 >> 0x30);
      local_17c8 = (ushort)((local_1828 - local_5b8) +
                           local_1868 + local_cb8 + local_d68 + local_d48 + local_d58) >> 4;
      uStack_17c6 = (ushort)((sStack_1826 - sStack_5b6) +
                            sStack_1866 + sStack_cb6 + sStack_d66 + sStack_d46 + sStack_d56) >> 4;
      uStack_17c4 = (ushort)((sStack_1824 - sStack_5b4) +
                            sStack_1864 + sStack_cb4 + sStack_d64 + sStack_d44 + sStack_d54) >> 4;
      uStack_17c2 = (ushort)((sStack_1822 - sStack_5b2) +
                            sStack_1862 + sStack_cb2 + sStack_d62 + sStack_d42 + sStack_d52) >> 4;
      uStack_17c0 = (ushort)((sStack_1820 - sStack_5b0) +
                            sStack_1860 + sStack_cb0 + sStack_d60 + sStack_d40 + sStack_d50) >> 4;
      uStack_17be = (ushort)((sStack_181e - sStack_5ae) +
                            sStack_185e + sStack_cae + sStack_d5e + sStack_d3e + sStack_d4e) >> 4;
      uStack_17bc = (ushort)((sStack_181c - sStack_5ac) +
                            sStack_185c + sStack_cac + sStack_d5c + sStack_d3c + sStack_d4c) >> 4;
      uStack_17ba = (ushort)((sStack_181a - sStack_5aa) +
                            sStack_185a + sStack_caa + sStack_d5a + sStack_d3a + sStack_d4a) >> 4;
      lVar1 = local_15c0[6][0];
      lVar2 = local_15c0[6][1];
      local_dd8 = (short)lVar1;
      sStack_dd6 = (short)((ulong)lVar1 >> 0x10);
      sStack_dd4 = (short)((ulong)lVar1 >> 0x20);
      sStack_dd2 = (short)((ulong)lVar1 >> 0x30);
      sStack_dd0 = (short)lVar2;
      sStack_dce = (short)((ulong)lVar2 >> 0x10);
      sStack_dcc = (short)((ulong)lVar2 >> 0x20);
      sStack_dca = (short)((ulong)lVar2 >> 0x30);
      local_dd8 = local_1858 + local_c98 + local_dd8;
      sStack_dd6 = sStack_1856 + sStack_c96 + sStack_dd6;
      sStack_dd4 = sStack_1854 + sStack_c94 + sStack_dd4;
      sStack_dd2 = sStack_1852 + sStack_c92 + sStack_dd2;
      sStack_dd0 = sStack_1850 + sStack_c90 + sStack_dd0;
      sStack_dce = sStack_184e + sStack_c8e + sStack_dce;
      sStack_dcc = sStack_184c + sStack_c8c + sStack_dcc;
      sStack_dca = sStack_184a + sStack_c8a + sStack_dca;
      lVar1 = local_15c8[6][0];
      lVar2 = local_15c8[6][1];
      local_df8 = (short)lVar1;
      sStack_df6 = (short)((ulong)lVar1 >> 0x10);
      sStack_df4 = (short)((ulong)lVar1 >> 0x20);
      sStack_df2 = (short)((ulong)lVar1 >> 0x30);
      sStack_df0 = (short)lVar2;
      sStack_dee = (short)((ulong)lVar2 >> 0x10);
      sStack_dec = (short)((ulong)lVar2 >> 0x20);
      sStack_dea = (short)((ulong)lVar2 >> 0x30);
      local_df8 = local_1868 + local_cb8 + local_df8;
      sStack_df6 = sStack_1866 + sStack_cb6 + sStack_df6;
      sStack_df4 = sStack_1864 + sStack_cb4 + sStack_df4;
      sStack_df2 = sStack_1862 + sStack_cb2 + sStack_df2;
      sStack_df0 = sStack_1860 + sStack_cb0 + sStack_df0;
      sStack_dee = sStack_185e + sStack_cae + sStack_dee;
      sStack_dec = sStack_185c + sStack_cac + sStack_dec;
      sStack_dea = sStack_185a + sStack_caa + sStack_dea;
      lVar1 = local_15c8[3][0];
      lVar2 = local_15c8[3][1];
      local_5d8 = (short)lVar1;
      sStack_5d6 = (short)((ulong)lVar1 >> 0x10);
      sStack_5d4 = (short)((ulong)lVar1 >> 0x20);
      sStack_5d2 = (short)((ulong)lVar1 >> 0x30);
      sStack_5d0 = (short)lVar2;
      sStack_5ce = (short)((ulong)lVar2 >> 0x10);
      sStack_5cc = (short)((ulong)lVar2 >> 0x20);
      sStack_5ca = (short)((ulong)lVar2 >> 0x30);
      local_5d8 = (local_1898 - local_598) - local_5d8;
      sStack_5d6 = (sStack_1896 - sStack_596) - sStack_5d6;
      sStack_5d4 = (sStack_1894 - sStack_594) - sStack_5d4;
      sStack_5d2 = (sStack_1892 - sStack_592) - sStack_5d2;
      sStack_5d0 = (sStack_1890 - sStack_590) - sStack_5d0;
      sStack_5ce = (sStack_188e - sStack_58e) - sStack_5ce;
      sStack_5cc = (sStack_188c - sStack_58c) - sStack_5cc;
      sStack_5ca = (sStack_188a - sStack_58a) - sStack_5ca;
      lVar1 = local_15c0[3][0];
      lVar2 = local_15c0[3][1];
      local_5f8 = (short)lVar1;
      sStack_5f6 = (short)((ulong)lVar1 >> 0x10);
      sStack_5f4 = (short)((ulong)lVar1 >> 0x20);
      sStack_5f2 = (short)((ulong)lVar1 >> 0x30);
      sStack_5f0 = (short)lVar2;
      sStack_5ee = (short)((ulong)lVar2 >> 0x10);
      sStack_5ec = (short)((ulong)lVar2 >> 0x20);
      sStack_5ea = (short)((ulong)lVar2 >> 0x30);
      local_5f8 = (local_1828 - local_5b8) - local_5f8;
      sStack_5f6 = (sStack_1826 - sStack_5b6) - sStack_5f6;
      sStack_5f4 = (sStack_1824 - sStack_5b4) - sStack_5f4;
      sStack_5f2 = (sStack_1822 - sStack_5b2) - sStack_5f2;
      sStack_5f0 = (sStack_1820 - sStack_5b0) - sStack_5f0;
      sStack_5ee = (sStack_181e - sStack_5ae) - sStack_5ee;
      sStack_5ec = (sStack_181c - sStack_5ac) - sStack_5ec;
      sStack_5ea = (sStack_181a - sStack_5aa) - sStack_5ea;
      lVar1 = local_15c0[3][0];
      lVar2 = local_15c0[3][1];
      lVar3 = local_15c0[4][0];
      lVar4 = local_15c0[4][1];
      lVar5 = local_15c0[2][0];
      lVar6 = local_15c0[2][1];
      local_e08 = (short)lVar3;
      sStack_e06 = (short)((ulong)lVar3 >> 0x10);
      sStack_e04 = (short)((ulong)lVar3 >> 0x20);
      sStack_e02 = (short)((ulong)lVar3 >> 0x30);
      sStack_e00 = (short)lVar4;
      sStack_dfe = (short)((ulong)lVar4 >> 0x10);
      sStack_dfc = (short)((ulong)lVar4 >> 0x20);
      sStack_dfa = (short)((ulong)lVar4 >> 0x30);
      local_e18 = (short)lVar5;
      sStack_e16 = (short)((ulong)lVar5 >> 0x10);
      sStack_e14 = (short)((ulong)lVar5 >> 0x20);
      sStack_e12 = (short)((ulong)lVar5 >> 0x30);
      sStack_e10 = (short)lVar6;
      sStack_e0e = (short)((ulong)lVar6 >> 0x10);
      sStack_e0c = (short)((ulong)lVar6 >> 0x20);
      sStack_e0a = (short)((ulong)lVar6 >> 0x30);
      local_e28 = (short)lVar1;
      sStack_e26 = (short)((ulong)lVar1 >> 0x10);
      sStack_e24 = (short)((ulong)lVar1 >> 0x20);
      sStack_e22 = (short)((ulong)lVar1 >> 0x30);
      sStack_e20 = (short)lVar2;
      sStack_e1e = (short)((ulong)lVar2 >> 0x10);
      sStack_e1c = (short)((ulong)lVar2 >> 0x20);
      sStack_e1a = (short)((ulong)lVar2 >> 0x30);
      local_1758 = (ushort)(local_5d8 + local_dd8 + local_e28 + local_e08 + local_e18) >> 4;
      uStack_1756 = (ushort)(sStack_5d6 + sStack_dd6 + sStack_e26 + sStack_e06 + sStack_e16) >> 4;
      uStack_1754 = (ushort)(sStack_5d4 + sStack_dd4 + sStack_e24 + sStack_e04 + sStack_e14) >> 4;
      uStack_1752 = (ushort)(sStack_5d2 + sStack_dd2 + sStack_e22 + sStack_e02 + sStack_e12) >> 4;
      uStack_1750 = (ushort)(sStack_5d0 + sStack_dd0 + sStack_e20 + sStack_e00 + sStack_e10) >> 4;
      uStack_174e = (ushort)(sStack_5ce + sStack_dce + sStack_e1e + sStack_dfe + sStack_e0e) >> 4;
      uStack_174c = (ushort)(sStack_5cc + sStack_dcc + sStack_e1c + sStack_dfc + sStack_e0c) >> 4;
      uStack_174a = (ushort)(sStack_5ca + sStack_dca + sStack_e1a + sStack_dfa + sStack_e0a) >> 4;
      lVar1 = local_15c8[3][0];
      lVar2 = local_15c8[3][1];
      lVar3 = local_15c8[2][0];
      lVar4 = local_15c8[2][1];
      lVar5 = local_15c8[4][0];
      lVar6 = local_15c8[4][1];
      local_e88 = (short)lVar3;
      sStack_e86 = (short)((ulong)lVar3 >> 0x10);
      sStack_e84 = (short)((ulong)lVar3 >> 0x20);
      sStack_e82 = (short)((ulong)lVar3 >> 0x30);
      sStack_e80 = (short)lVar4;
      sStack_e7e = (short)((ulong)lVar4 >> 0x10);
      sStack_e7c = (short)((ulong)lVar4 >> 0x20);
      sStack_e7a = (short)((ulong)lVar4 >> 0x30);
      local_e98 = (short)lVar5;
      sStack_e96 = (short)((ulong)lVar5 >> 0x10);
      sStack_e94 = (short)((ulong)lVar5 >> 0x20);
      sStack_e92 = (short)((ulong)lVar5 >> 0x30);
      sStack_e90 = (short)lVar6;
      sStack_e8e = (short)((ulong)lVar6 >> 0x10);
      sStack_e8c = (short)((ulong)lVar6 >> 0x20);
      sStack_e8a = (short)((ulong)lVar6 >> 0x30);
      local_ea8 = (short)lVar1;
      sStack_ea6 = (short)((ulong)lVar1 >> 0x10);
      sStack_ea4 = (short)((ulong)lVar1 >> 0x20);
      sStack_ea2 = (short)((ulong)lVar1 >> 0x30);
      sStack_ea0 = (short)lVar2;
      sStack_e9e = (short)((ulong)lVar2 >> 0x10);
      sStack_e9c = (short)((ulong)lVar2 >> 0x20);
      sStack_e9a = (short)((ulong)lVar2 >> 0x30);
      local_17b8 = (ushort)(local_5f8 + local_df8 + local_ea8 + local_e88 + local_e98) >> 4;
      uStack_17b6 = (ushort)(sStack_5f6 + sStack_df6 + sStack_ea6 + sStack_e86 + sStack_e96) >> 4;
      uStack_17b4 = (ushort)(sStack_5f4 + sStack_df4 + sStack_ea4 + sStack_e84 + sStack_e94) >> 4;
      uStack_17b2 = (ushort)(sStack_5f2 + sStack_df2 + sStack_ea2 + sStack_e82 + sStack_e92) >> 4;
      uStack_17b0 = (ushort)(sStack_5f0 + sStack_df0 + sStack_ea0 + sStack_e80 + sStack_e90) >> 4;
      uStack_17ae = (ushort)(sStack_5ee + sStack_dee + sStack_e9e + sStack_e7e + sStack_e8e) >> 4;
      uStack_17ac = (ushort)(sStack_5ec + sStack_dec + sStack_e9c + sStack_e7c + sStack_e8c) >> 4;
      uStack_17aa = (ushort)(sStack_5ea + sStack_dea + sStack_e9a + sStack_e7a + sStack_e8a) >> 4;
      lVar1 = local_15c0[6][0];
      lVar2 = local_15c0[6][1];
      local_f18 = (short)lVar1;
      sStack_f16 = (short)((ulong)lVar1 >> 0x10);
      sStack_f14 = (short)((ulong)lVar1 >> 0x20);
      sStack_f12 = (short)((ulong)lVar1 >> 0x30);
      sStack_f10 = (short)lVar2;
      sStack_f0e = (short)((ulong)lVar2 >> 0x10);
      sStack_f0c = (short)((ulong)lVar2 >> 0x20);
      sStack_f0a = (short)((ulong)lVar2 >> 0x30);
      local_dd8 = local_dd8 + local_f18;
      sStack_dd6 = sStack_dd6 + sStack_f16;
      sStack_dd4 = sStack_dd4 + sStack_f14;
      sStack_dd2 = sStack_dd2 + sStack_f12;
      sStack_dd0 = sStack_dd0 + sStack_f10;
      sStack_dce = sStack_dce + sStack_f0e;
      sStack_dcc = sStack_dcc + sStack_f0c;
      sStack_dca = sStack_dca + sStack_f0a;
      lVar1 = local_15c8[6][0];
      lVar2 = local_15c8[6][1];
      local_f38 = (short)lVar1;
      sStack_f36 = (short)((ulong)lVar1 >> 0x10);
      sStack_f34 = (short)((ulong)lVar1 >> 0x20);
      sStack_f32 = (short)((ulong)lVar1 >> 0x30);
      sStack_f30 = (short)lVar2;
      sStack_f2e = (short)((ulong)lVar2 >> 0x10);
      sStack_f2c = (short)((ulong)lVar2 >> 0x20);
      sStack_f2a = (short)((ulong)lVar2 >> 0x30);
      local_df8 = local_df8 + local_f38;
      sStack_df6 = sStack_df6 + sStack_f36;
      sStack_df4 = sStack_df4 + sStack_f34;
      sStack_df2 = sStack_df2 + sStack_f32;
      sStack_df0 = sStack_df0 + sStack_f30;
      sStack_dee = sStack_dee + sStack_f2e;
      sStack_dec = sStack_dec + sStack_f2c;
      sStack_dea = sStack_dea + sStack_f2a;
      lVar1 = local_15c8[2][0];
      lVar2 = local_15c8[2][1];
      local_618 = (short)lVar1;
      sStack_616 = (short)((ulong)lVar1 >> 0x10);
      sStack_614 = (short)((ulong)lVar1 >> 0x20);
      sStack_612 = (short)((ulong)lVar1 >> 0x30);
      sStack_610 = (short)lVar2;
      sStack_60e = (short)((ulong)lVar2 >> 0x10);
      sStack_60c = (short)((ulong)lVar2 >> 0x20);
      sStack_60a = (short)((ulong)lVar2 >> 0x30);
      local_5d8 = local_5d8 - local_618;
      sStack_5d6 = sStack_5d6 - sStack_616;
      sStack_5d4 = sStack_5d4 - sStack_614;
      sStack_5d2 = sStack_5d2 - sStack_612;
      sStack_5d0 = sStack_5d0 - sStack_610;
      sStack_5ce = sStack_5ce - sStack_60e;
      sStack_5cc = sStack_5cc - sStack_60c;
      sStack_5ca = sStack_5ca - sStack_60a;
      lVar1 = local_15c0[2][0];
      lVar2 = local_15c0[2][1];
      local_638 = (short)lVar1;
      sStack_636 = (short)((ulong)lVar1 >> 0x10);
      sStack_634 = (short)((ulong)lVar1 >> 0x20);
      sStack_632 = (short)((ulong)lVar1 >> 0x30);
      sStack_630 = (short)lVar2;
      sStack_62e = (short)((ulong)lVar2 >> 0x10);
      sStack_62c = (short)((ulong)lVar2 >> 0x20);
      sStack_62a = (short)((ulong)lVar2 >> 0x30);
      local_5f8 = local_5f8 - local_638;
      sStack_5f6 = sStack_5f6 - sStack_636;
      sStack_5f4 = sStack_5f4 - sStack_634;
      sStack_5f2 = sStack_5f2 - sStack_632;
      sStack_5f0 = sStack_5f0 - sStack_630;
      sStack_5ee = sStack_5ee - sStack_62e;
      sStack_5ec = sStack_5ec - sStack_62c;
      sStack_5ea = sStack_5ea - sStack_62a;
      lVar1 = local_15c0[4][0];
      lVar2 = local_15c0[4][1];
      lVar3 = local_15c0[5][0];
      lVar4 = local_15c0[5][1];
      lVar5 = local_15c0[3][0];
      lVar6 = local_15c0[3][1];
      local_f48 = (short)lVar3;
      sStack_f46 = (short)((ulong)lVar3 >> 0x10);
      sStack_f44 = (short)((ulong)lVar3 >> 0x20);
      sStack_f42 = (short)((ulong)lVar3 >> 0x30);
      sStack_f40 = (short)lVar4;
      sStack_f3e = (short)((ulong)lVar4 >> 0x10);
      sStack_f3c = (short)((ulong)lVar4 >> 0x20);
      sStack_f3a = (short)((ulong)lVar4 >> 0x30);
      local_f58 = (short)lVar5;
      sStack_f56 = (short)((ulong)lVar5 >> 0x10);
      sStack_f54 = (short)((ulong)lVar5 >> 0x20);
      sStack_f52 = (short)((ulong)lVar5 >> 0x30);
      sStack_f50 = (short)lVar6;
      sStack_f4e = (short)((ulong)lVar6 >> 0x10);
      sStack_f4c = (short)((ulong)lVar6 >> 0x20);
      sStack_f4a = (short)((ulong)lVar6 >> 0x30);
      local_f68 = (short)lVar1;
      sStack_f66 = (short)((ulong)lVar1 >> 0x10);
      sStack_f64 = (short)((ulong)lVar1 >> 0x20);
      sStack_f62 = (short)((ulong)lVar1 >> 0x30);
      sStack_f60 = (short)lVar2;
      sStack_f5e = (short)((ulong)lVar2 >> 0x10);
      sStack_f5c = (short)((ulong)lVar2 >> 0x20);
      sStack_f5a = (short)((ulong)lVar2 >> 0x30);
      local_1748 = (ushort)(local_5d8 + local_dd8 + local_f68 + local_f48 + local_f58) >> 4;
      uStack_1746 = (ushort)(sStack_5d6 + sStack_dd6 + sStack_f66 + sStack_f46 + sStack_f56) >> 4;
      uStack_1744 = (ushort)(sStack_5d4 + sStack_dd4 + sStack_f64 + sStack_f44 + sStack_f54) >> 4;
      uStack_1742 = (ushort)(sStack_5d2 + sStack_dd2 + sStack_f62 + sStack_f42 + sStack_f52) >> 4;
      uStack_1740 = (ushort)(sStack_5d0 + sStack_dd0 + sStack_f60 + sStack_f40 + sStack_f50) >> 4;
      uStack_173e = (ushort)(sStack_5ce + sStack_dce + sStack_f5e + sStack_f3e + sStack_f4e) >> 4;
      uStack_173c = (ushort)(sStack_5cc + sStack_dcc + sStack_f5c + sStack_f3c + sStack_f4c) >> 4;
      uStack_173a = (ushort)(sStack_5ca + sStack_dca + sStack_f5a + sStack_f3a + sStack_f4a) >> 4;
      lVar1 = local_15c8[4][0];
      lVar2 = local_15c8[4][1];
      lVar3 = local_15c8[3][0];
      lVar4 = local_15c8[3][1];
      lVar5 = local_15c8[5][0];
      lVar6 = local_15c8[5][1];
      local_fc8 = (short)lVar3;
      sStack_fc6 = (short)((ulong)lVar3 >> 0x10);
      sStack_fc4 = (short)((ulong)lVar3 >> 0x20);
      sStack_fc2 = (short)((ulong)lVar3 >> 0x30);
      sStack_fc0 = (short)lVar4;
      sStack_fbe = (short)((ulong)lVar4 >> 0x10);
      sStack_fbc = (short)((ulong)lVar4 >> 0x20);
      sStack_fba = (short)((ulong)lVar4 >> 0x30);
      local_fd8 = (short)lVar5;
      sStack_fd6 = (short)((ulong)lVar5 >> 0x10);
      sStack_fd4 = (short)((ulong)lVar5 >> 0x20);
      sStack_fd2 = (short)((ulong)lVar5 >> 0x30);
      sStack_fd0 = (short)lVar6;
      sStack_fce = (short)((ulong)lVar6 >> 0x10);
      sStack_fcc = (short)((ulong)lVar6 >> 0x20);
      sStack_fca = (short)((ulong)lVar6 >> 0x30);
      local_fe8 = (short)lVar1;
      sStack_fe6 = (short)((ulong)lVar1 >> 0x10);
      sStack_fe4 = (short)((ulong)lVar1 >> 0x20);
      sStack_fe2 = (short)((ulong)lVar1 >> 0x30);
      sStack_fe0 = (short)lVar2;
      sStack_fde = (short)((ulong)lVar2 >> 0x10);
      sStack_fdc = (short)((ulong)lVar2 >> 0x20);
      sStack_fda = (short)((ulong)lVar2 >> 0x30);
      local_17a8 = (ushort)(local_5f8 + local_df8 + local_fe8 + local_fc8 + local_fd8) >> 4;
      uStack_17a6 = (ushort)(sStack_5f6 + sStack_df6 + sStack_fe6 + sStack_fc6 + sStack_fd6) >> 4;
      uStack_17a4 = (ushort)(sStack_5f4 + sStack_df4 + sStack_fe4 + sStack_fc4 + sStack_fd4) >> 4;
      uStack_17a2 = (ushort)(sStack_5f2 + sStack_df2 + sStack_fe2 + sStack_fc2 + sStack_fd2) >> 4;
      uStack_17a0 = (ushort)(sStack_5f0 + sStack_df0 + sStack_fe0 + sStack_fc0 + sStack_fd0) >> 4;
      uStack_179e = (ushort)(sStack_5ee + sStack_dee + sStack_fde + sStack_fbe + sStack_fce) >> 4;
      uStack_179c = (ushort)(sStack_5ec + sStack_dec + sStack_fdc + sStack_fbc + sStack_fcc) >> 4;
      uStack_179a = (ushort)(sStack_5ea + sStack_dea + sStack_fda + sStack_fba + sStack_fca) >> 4;
      lVar1 = local_15c0[6][0];
      lVar2 = local_15c0[6][1];
      local_1058 = (short)lVar1;
      sStack_1056 = (short)((ulong)lVar1 >> 0x10);
      sStack_1054 = (short)((ulong)lVar1 >> 0x20);
      sStack_1052 = (short)((ulong)lVar1 >> 0x30);
      sStack_1050 = (short)lVar2;
      sStack_104e = (short)((ulong)lVar2 >> 0x10);
      sStack_104c = (short)((ulong)lVar2 >> 0x20);
      sStack_104a = (short)((ulong)lVar2 >> 0x30);
      local_1858 = local_dd8 + local_1058;
      sStack_1856 = sStack_dd6 + sStack_1056;
      sStack_1854 = sStack_dd4 + sStack_1054;
      sStack_1852 = sStack_dd2 + sStack_1052;
      sStack_1850 = sStack_dd0 + sStack_1050;
      sStack_184e = sStack_dce + sStack_104e;
      sStack_184c = sStack_dcc + sStack_104c;
      sStack_184a = sStack_dca + sStack_104a;
      lVar1 = local_15c8[6][0];
      lVar2 = local_15c8[6][1];
      local_1078 = (short)lVar1;
      sStack_1076 = (short)((ulong)lVar1 >> 0x10);
      sStack_1074 = (short)((ulong)lVar1 >> 0x20);
      sStack_1072 = (short)((ulong)lVar1 >> 0x30);
      sStack_1070 = (short)lVar2;
      sStack_106e = (short)((ulong)lVar2 >> 0x10);
      sStack_106c = (short)((ulong)lVar2 >> 0x20);
      sStack_106a = (short)((ulong)lVar2 >> 0x30);
      local_1868 = local_df8 + local_1078;
      sStack_1866 = sStack_df6 + sStack_1076;
      sStack_1864 = sStack_df4 + sStack_1074;
      sStack_1862 = sStack_df2 + sStack_1072;
      sStack_1860 = sStack_df0 + sStack_1070;
      sStack_185e = sStack_dee + sStack_106e;
      sStack_185c = sStack_dec + sStack_106c;
      sStack_185a = sStack_dea + sStack_106a;
      lVar1 = local_15c8[1][0];
      lVar2 = local_15c8[1][1];
      local_658 = (short)lVar1;
      sStack_656 = (short)((ulong)lVar1 >> 0x10);
      sStack_654 = (short)((ulong)lVar1 >> 0x20);
      sStack_652 = (short)((ulong)lVar1 >> 0x30);
      sStack_650 = (short)lVar2;
      sStack_64e = (short)((ulong)lVar2 >> 0x10);
      sStack_64c = (short)((ulong)lVar2 >> 0x20);
      sStack_64a = (short)((ulong)lVar2 >> 0x30);
      local_1898 = local_5d8 - local_658;
      sStack_1896 = sStack_5d6 - sStack_656;
      sStack_1894 = sStack_5d4 - sStack_654;
      sStack_1892 = sStack_5d2 - sStack_652;
      sStack_1890 = sStack_5d0 - sStack_650;
      sStack_188e = sStack_5ce - sStack_64e;
      sStack_188c = sStack_5cc - sStack_64c;
      sStack_188a = sStack_5ca - sStack_64a;
      lVar1 = local_15c0[1][0];
      lVar2 = local_15c0[1][1];
      local_678 = (short)lVar1;
      sStack_676 = (short)((ulong)lVar1 >> 0x10);
      sStack_674 = (short)((ulong)lVar1 >> 0x20);
      sStack_672 = (short)((ulong)lVar1 >> 0x30);
      sStack_670 = (short)lVar2;
      sStack_66e = (short)((ulong)lVar2 >> 0x10);
      sStack_66c = (short)((ulong)lVar2 >> 0x20);
      sStack_66a = (short)((ulong)lVar2 >> 0x30);
      local_1828 = local_5f8 - local_678;
      sStack_1826 = sStack_5f6 - sStack_676;
      sStack_1824 = sStack_5f4 - sStack_674;
      sStack_1822 = sStack_5f2 - sStack_672;
      sStack_1820 = sStack_5f0 - sStack_670;
      sStack_181e = sStack_5ee - sStack_66e;
      sStack_181c = sStack_5ec - sStack_66c;
      sStack_181a = sStack_5ea - sStack_66a;
      lVar1 = local_15c0[5][0];
      lVar2 = local_15c0[5][1];
      lVar3 = local_15c0[6][0];
      lVar4 = local_15c0[6][1];
      lVar5 = local_15c0[4][0];
      lVar6 = local_15c0[4][1];
      local_1088 = (short)lVar3;
      sStack_1086 = (short)((ulong)lVar3 >> 0x10);
      sStack_1084 = (short)((ulong)lVar3 >> 0x20);
      sStack_1082 = (short)((ulong)lVar3 >> 0x30);
      sStack_1080 = (short)lVar4;
      sStack_107e = (short)((ulong)lVar4 >> 0x10);
      sStack_107c = (short)((ulong)lVar4 >> 0x20);
      sStack_107a = (short)((ulong)lVar4 >> 0x30);
      local_1098 = (short)lVar5;
      sStack_1096 = (short)((ulong)lVar5 >> 0x10);
      sStack_1094 = (short)((ulong)lVar5 >> 0x20);
      sStack_1092 = (short)((ulong)lVar5 >> 0x30);
      sStack_1090 = (short)lVar6;
      sStack_108e = (short)((ulong)lVar6 >> 0x10);
      sStack_108c = (short)((ulong)lVar6 >> 0x20);
      sStack_108a = (short)((ulong)lVar6 >> 0x30);
      local_10a8 = (short)lVar1;
      sStack_10a6 = (short)((ulong)lVar1 >> 0x10);
      sStack_10a4 = (short)((ulong)lVar1 >> 0x20);
      sStack_10a2 = (short)((ulong)lVar1 >> 0x30);
      sStack_10a0 = (short)lVar2;
      sStack_109e = (short)((ulong)lVar2 >> 0x10);
      sStack_109c = (short)((ulong)lVar2 >> 0x20);
      sStack_109a = (short)((ulong)lVar2 >> 0x30);
      local_1738 = (ushort)(local_1898 + local_1858 + local_10a8 + local_1088 + local_1098) >> 4;
      uStack_1736 = (ushort)(sStack_1896 + sStack_1856 + sStack_10a6 + sStack_1086 + sStack_1096) >>
                    4;
      uStack_1734 = (ushort)(sStack_1894 + sStack_1854 + sStack_10a4 + sStack_1084 + sStack_1094) >>
                    4;
      uStack_1732 = (ushort)(sStack_1892 + sStack_1852 + sStack_10a2 + sStack_1082 + sStack_1092) >>
                    4;
      uStack_1730 = (ushort)(sStack_1890 + sStack_1850 + sStack_10a0 + sStack_1080 + sStack_1090) >>
                    4;
      uStack_172e = (ushort)(sStack_188e + sStack_184e + sStack_109e + sStack_107e + sStack_108e) >>
                    4;
      uStack_172c = (ushort)(sStack_188c + sStack_184c + sStack_109c + sStack_107c + sStack_108c) >>
                    4;
      uStack_172a = (ushort)(sStack_188a + sStack_184a + sStack_109a + sStack_107a + sStack_108a) >>
                    4;
      lVar1 = local_15c8[5][0];
      lVar2 = local_15c8[5][1];
      lVar3 = local_15c8[4][0];
      lVar4 = local_15c8[4][1];
      lVar5 = local_15c8[6][0];
      lVar6 = local_15c8[6][1];
      local_1108 = (short)lVar3;
      sStack_1106 = (short)((ulong)lVar3 >> 0x10);
      sStack_1104 = (short)((ulong)lVar3 >> 0x20);
      sStack_1102 = (short)((ulong)lVar3 >> 0x30);
      sStack_1100 = (short)lVar4;
      sStack_10fe = (short)((ulong)lVar4 >> 0x10);
      sStack_10fc = (short)((ulong)lVar4 >> 0x20);
      sStack_10fa = (short)((ulong)lVar4 >> 0x30);
      local_1118 = (short)lVar5;
      sStack_1116 = (short)((ulong)lVar5 >> 0x10);
      sStack_1114 = (short)((ulong)lVar5 >> 0x20);
      sStack_1112 = (short)((ulong)lVar5 >> 0x30);
      sStack_1110 = (short)lVar6;
      sStack_110e = (short)((ulong)lVar6 >> 0x10);
      sStack_110c = (short)((ulong)lVar6 >> 0x20);
      sStack_110a = (short)((ulong)lVar6 >> 0x30);
      local_1128 = (short)lVar1;
      sStack_1126 = (short)((ulong)lVar1 >> 0x10);
      sStack_1124 = (short)((ulong)lVar1 >> 0x20);
      sStack_1122 = (short)((ulong)lVar1 >> 0x30);
      sStack_1120 = (short)lVar2;
      sStack_111e = (short)((ulong)lVar2 >> 0x10);
      sStack_111c = (short)((ulong)lVar2 >> 0x20);
      sStack_111a = (short)((ulong)lVar2 >> 0x30);
      local_1798 = (ushort)(local_1828 + local_1868 + local_1128 + local_1108 + local_1118) >> 4;
      uStack_1796 = (ushort)(sStack_1826 + sStack_1866 + sStack_1126 + sStack_1106 + sStack_1116) >>
                    4;
      uStack_1794 = (ushort)(sStack_1824 + sStack_1864 + sStack_1124 + sStack_1104 + sStack_1114) >>
                    4;
      uStack_1792 = (ushort)(sStack_1822 + sStack_1862 + sStack_1122 + sStack_1102 + sStack_1112) >>
                    4;
      uStack_1790 = (ushort)(sStack_1820 + sStack_1860 + sStack_1120 + sStack_1100 + sStack_1110) >>
                    4;
      uStack_178e = (ushort)(sStack_181e + sStack_185e + sStack_111e + sStack_10fe + sStack_110e) >>
                    4;
      uStack_178c = (ushort)(sStack_181c + sStack_185c + sStack_111c + sStack_10fc + sStack_110c) >>
                    4;
      uStack_178a = (ushort)(sStack_181a + sStack_185a + sStack_111a + sStack_10fa + sStack_110a) >>
                    4;
    }
    for (local_18a0 = 0; local_18a0 < 2; local_18a0 = local_18a0 + 1) {
      uVar7 = local_16a8[(long)local_18a0 * 2 + 1];
      local_16a8[(long)local_18a0 * 2] = ~local_1678 & local_16a8[(long)local_18a0 * 2];
      local_16a8[(long)local_18a0 * 2 + 1] = ~uStack_1670 & uVar7;
      uStack_1300 = *(ulong *)(&uStack_16f0 + (long)local_18a0 * 8);
      local_12f8 = local_1678;
      uStack_12f0 = uStack_1670;
      local_1308 = *(ulong *)(&local_16f8 + (long)local_18a0 * 8);
      *(ulong *)(&local_16f8 + (long)local_18a0 * 8) =
           local_1678 & *(ulong *)(&local_16f8 + (long)local_18a0 * 8);
      *(ulong *)(&uStack_16f0 + (long)local_18a0 * 8) = uStack_1670 & uStack_1300;
      lVar10 = (long)local_18a0;
      uVar7 = local_16a8[lVar10 * 2 + 1];
      uVar18 = *(ulong *)(&uStack_16f0 + lVar10 * 8);
      local_15c0[local_18a0][0] = local_16a8[lVar10 * 2] | *(ulong *)(&local_16f8 + lVar10 * 8);
      local_15c0[local_18a0][1] = uVar7 | uVar18;
      local_268 = (uint)local_1678;
      uStack_264 = (uint)(local_1678 >> 0x20);
      uStack_260 = (uint)uStack_1670;
      uStack_25c = (uint)(uStack_1670 >> 0x20);
      local_278 = (uint)(&local_16c8)[(long)local_18a0 * 2];
      uStack_274 = (uint)((ulong)(&local_16c8)[(long)local_18a0 * 2] >> 0x20);
      uStack_270 = (uint)(&uStack_16c0)[(long)local_18a0 * 2];
      uStack_26c = (uint)((ulong)(&uStack_16c0)[(long)local_18a0 * 2] >> 0x20);
      lVar10 = (long)local_18a0;
      *(uint *)(&local_16c8 + lVar10 * 2) = (local_268 ^ 0xffffffff) & local_278;
      *(uint *)((long)&local_16c8 + lVar10 * 0x10 + 4) = (uStack_264 ^ 0xffffffff) & uStack_274;
      *(uint *)(&uStack_16c0 + lVar10 * 2) = (uStack_260 ^ 0xffffffff) & uStack_270;
      *(uint *)((long)&uStack_16c0 + lVar10 * 0x10 + 4) = (uStack_25c ^ 0xffffffff) & uStack_26c;
      uStack_1320 = *(ulong *)(&uStack_1720 + (long)local_18a0 * 8);
      local_1318 = local_1678;
      uStack_1310 = uStack_1670;
      local_1328 = *(ulong *)(&local_1728 + (long)local_18a0 * 8);
      *(ulong *)(&local_1728 + (long)local_18a0 * 8) =
           local_1678 & *(ulong *)(&local_1728 + (long)local_18a0 * 8);
      *(ulong *)(&uStack_1720 + (long)local_18a0 * 8) = uStack_1670 & uStack_1320;
      uVar7 = (&uStack_16c0)[(long)local_18a0 * 2];
      uVar18 = *(ulong *)(&uStack_1720 + (long)local_18a0 * 8);
      local_15c8[local_18a0][0] =
           (&local_16c8)[(long)local_18a0 * 2] | *(ulong *)(&local_1728 + (long)local_18a0 * 8);
      local_15c8[local_18a0][1] = uVar7 | uVar18;
    }
    uVar7 = local_15c0[2][1];
    uVar18 = ~uStack_1670;
    local_15c0[2][0] = ~local_1678 & local_15c0[2][0];
    palVar24[2][1] = uVar18 & uVar7;
    palVar24 = local_15c0;
    local_16d8 = local_1678 & local_16d8;
    uVar18 = uStack_1670 & uStack_16d0;
    uStack_16d0 = uVar18;
    uVar7 = local_15c0[2][1];
    local_15c0[2][0] = local_15c0[2][0] | local_16d8;
    palVar24[2][1] = uVar7 | uVar18;
    palVar24 = local_15c8;
    local_1a8 = (uint)local_1678;
    uStack_1a4 = (uint)(local_1678 >> 0x20);
    uStack_1a0 = (uint)uStack_1670;
    uStack_19c = (uint)(uStack_1670 >> 0x20);
    local_1b8 = (uint)local_15c8[2][0];
    uStack_1b4 = (uint)((ulong)local_15c8[2][0] >> 0x20);
    uStack_1b0 = (uint)local_15c8[2][1];
    uStack_1ac = (uint)((ulong)local_15c8[2][1] >> 0x20);
    *(uint *)local_15c8[2] = (local_1a8 ^ 0xffffffff) & local_1b8;
    *(uint *)((long)palVar24[2] + 4) = (uStack_1a4 ^ 0xffffffff) & uStack_1b4;
    *(uint *)(palVar24[2] + 1) = (uStack_1a0 ^ 0xffffffff) & uStack_1b0;
    *(uint *)((long)palVar24[2] + 0xc) = (uStack_19c ^ 0xffffffff) & uStack_1ac;
    palVar24 = local_15c8;
    local_1258 = local_1678;
    local_1268 = local_1708;
    uStack_1260 = uStack_1700;
    local_1708 = local_1678 & local_1708;
    uVar18 = uStack_1670 & uStack_1700;
    uStack_1700 = uVar18;
    uVar7 = local_15c8[2][1];
    local_15c8[2][0] = local_15c8[2][0] | local_1708;
    palVar24[2][1] = uVar7 | uVar18;
    for (local_18a0 = 0; local_18a0 < 2; local_18a0 = local_18a0 + 1) {
      uVar7 = local_16a8[(long)local_18a0 * 2 + 1];
      local_16a8[(long)local_18a0 * 2] = ~local_1678 & local_16a8[(long)local_18a0 * 2];
      local_16a8[(long)local_18a0 * 2 + 1] = ~uStack_1670 & uVar7;
      uStack_12c0 = *(ulong *)(&uStack_16f0 + (long)local_18a0 * 8);
      local_12b8 = local_1678;
      uStack_12b0 = uStack_1670;
      local_12c8 = *(ulong *)(&local_16f8 + (long)local_18a0 * 8);
      *(ulong *)(&local_16f8 + (long)local_18a0 * 8) =
           local_1678 & *(ulong *)(&local_16f8 + (long)local_18a0 * 8);
      *(ulong *)(&uStack_16f0 + (long)local_18a0 * 8) = uStack_1670 & uStack_12c0;
      lVar10 = (long)local_18a0;
      uVar7 = local_16a8[lVar10 * 2 + 1];
      uVar18 = *(ulong *)(&uStack_16f0 + lVar10 * 8);
      local_15c0[local_18a0][0] = local_16a8[lVar10 * 2] | *(ulong *)(&local_16f8 + lVar10 * 8);
      local_15c0[local_18a0][1] = uVar7 | uVar18;
      local_228 = (uint)local_1678;
      uStack_224 = (uint)(local_1678 >> 0x20);
      uStack_220 = (uint)uStack_1670;
      uStack_21c = (uint)(uStack_1670 >> 0x20);
      local_238 = (uint)(&local_16c8)[(long)local_18a0 * 2];
      uStack_234 = (uint)((ulong)(&local_16c8)[(long)local_18a0 * 2] >> 0x20);
      uStack_230 = (uint)(&uStack_16c0)[(long)local_18a0 * 2];
      uStack_22c = (uint)((ulong)(&uStack_16c0)[(long)local_18a0 * 2] >> 0x20);
      lVar10 = (long)local_18a0;
      *(uint *)(&local_16c8 + lVar10 * 2) = (local_228 ^ 0xffffffff) & local_238;
      *(uint *)((long)&local_16c8 + lVar10 * 0x10 + 4) = (uStack_224 ^ 0xffffffff) & uStack_234;
      *(uint *)(&uStack_16c0 + lVar10 * 2) = (uStack_220 ^ 0xffffffff) & uStack_230;
      *(uint *)((long)&uStack_16c0 + lVar10 * 0x10 + 4) = (uStack_21c ^ 0xffffffff) & uStack_22c;
      uStack_12e0 = *(ulong *)(&uStack_1720 + (long)local_18a0 * 8);
      local_12d8 = local_1678;
      uStack_12d0 = uStack_1670;
      local_12e8 = *(ulong *)(&local_1728 + (long)local_18a0 * 8);
      *(ulong *)(&local_1728 + (long)local_18a0 * 8) =
           local_1678 & *(ulong *)(&local_1728 + (long)local_18a0 * 8);
      *(ulong *)(&uStack_1720 + (long)local_18a0 * 8) = uStack_1670 & uStack_12e0;
      uVar7 = (&uStack_16c0)[(long)local_18a0 * 2];
      uVar18 = *(ulong *)(&uStack_1720 + (long)local_18a0 * 8);
      local_15c8[local_18a0][0] =
           (&local_16c8)[(long)local_18a0 * 2] | *(ulong *)(&local_1728 + (long)local_18a0 * 8);
      local_15c8[local_18a0][1] = uVar7 | uVar18;
    }
    if (local_189c != 0) {
      for (local_18a0 = 0; local_18a0 < 6; local_18a0 = local_18a0 + 1) {
        uVar7 = local_15c0[local_18a0][1];
        local_15c0[local_18a0][0] = ~local_1688 & local_15c0[local_18a0][0];
        local_15c0[local_18a0][1] = ~uStack_1680 & uVar7;
        uStack_1280 = (&uStack_1780)[(long)local_18a0 * 2];
        local_1278 = local_1688;
        uStack_1270 = uStack_1680;
        local_1288 = (&local_1788)[(long)local_18a0 * 2];
        (&local_1788)[(long)local_18a0 * 2] = local_1688 & (&local_1788)[(long)local_18a0 * 2];
        (&uStack_1780)[(long)local_18a0 * 2] = uStack_1680 & uStack_1280;
        lVar10 = (long)local_18a0;
        uVar7 = local_15c0[lVar10][1];
        uVar18 = (&uStack_1780)[lVar10 * 2];
        local_15c0[local_18a0][0] = local_15c0[lVar10][0] | (&local_1788)[lVar10 * 2];
        local_15c0[local_18a0][1] = uVar7 | uVar18;
        lVar1 = local_15c8[local_18a0][0];
        lVar2 = local_15c8[local_18a0][1];
        local_1e8 = (uint)local_1688;
        uStack_1e4 = (uint)(local_1688 >> 0x20);
        uStack_1e0 = (uint)uStack_1680;
        uStack_1dc = (uint)(uStack_1680 >> 0x20);
        local_1f8 = (uint)lVar1;
        uStack_1f4 = (uint)((ulong)lVar1 >> 0x20);
        uStack_1f0 = (uint)lVar2;
        uStack_1ec = (uint)((ulong)lVar2 >> 0x20);
        palVar24 = local_15c8 + local_18a0;
        *(uint *)*palVar24 = (local_1e8 ^ 0xffffffff) & local_1f8;
        *(uint *)((long)*palVar24 + 4) = (uStack_1e4 ^ 0xffffffff) & uStack_1f4;
        *(uint *)(*palVar24 + 1) = (uStack_1e0 ^ 0xffffffff) & uStack_1f0;
        *(uint *)((long)*palVar24 + 0xc) = (uStack_1dc ^ 0xffffffff) & uStack_1ec;
        uStack_12a0 = (&uStack_17e0)[(long)local_18a0 * 2];
        local_1298 = local_1688;
        uStack_1290 = uStack_1680;
        local_12a8 = (&local_17e8)[(long)local_18a0 * 2];
        (&local_17e8)[(long)local_18a0 * 2] = local_1688 & (&local_17e8)[(long)local_18a0 * 2];
        (&uStack_17e0)[(long)local_18a0 * 2] = uStack_1680 & uStack_12a0;
        uVar7 = local_15c8[local_18a0][1];
        uVar18 = (&uStack_17e0)[(long)local_18a0 * 2];
        local_15c8[local_18a0][0] = local_15c8[local_18a0][0] | (&local_17e8)[(long)local_18a0 * 2];
        local_15c8[local_18a0][1] = uVar7 | uVar18;
      }
    }
  }
  palVar24 = &local_19a8;
  highbd_transpose8x8_sse2
            (palVar24,(__m128i *)&stack0xffffffffffffe4a8,(__m128i *)&stack0xffffffffffffe4b8,
             (__m128i *)&local_1b38,(__m128i *)&local_1b28,(__m128i *)&local_1b18,x6,x7,x1,d1,l,bl,
             th,palVar23,qs_00,in_stack_ffffffffffffe4a8);
  local_13c0 = local_18a8 + -2;
  local_13d8 = local_1ae8;
  uStack_13d0 = uStack_1ae0;
  *local_13c0 = local_1ae8;
  local_18a8[-1] = uStack_1ae0;
  local_13e0 = (undefined8 *)((long)local_18a8 + (long)local_18ac * 2 + -0x10);
  local_13f8 = local_1af8;
  uStack_13f0 = uStack_1af0;
  *local_13e0 = local_1af8;
  local_13e0[1] = uStack_1af0;
  local_1400 = (undefined8 *)((long)local_18a8 + (long)(local_18ac << 1) * 2 + -0x10);
  local_1418 = local_1b08;
  uStack_1410 = uStack_1b00;
  *local_1400 = local_1b08;
  local_1400[1] = uStack_1b00;
  local_1420 = (longlong *)((long)local_18a8 + (long)(local_18ac * 3) * 2 + -0x10);
  local_1438 = local_1b18;
  lStack_1430 = lStack_1b10;
  *local_1420 = local_1b18;
  local_1420[1] = lStack_1b10;
  local_1440 = (longlong *)((long)local_18a8 + (long)(local_18ac << 2) * 2 + -0x10);
  local_1458 = local_1b28;
  lStack_1450 = lStack_1b20;
  *local_1440 = local_1b28;
  local_1440[1] = lStack_1b20;
  local_1460 = (longlong *)((long)local_18a8 + (long)(local_18ac * 5) * 2 + -0x10);
  local_1478 = local_1b38;
  lStack_1470 = lStack_1b30;
  *local_1460 = local_1b38;
  local_1460[1] = lStack_1b30;
  local_1480 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 6) * 2 + -0x10);
  *local_1480 = in_stack_ffffffffffffe4b8;
  local_1480[1] = lStack_1b40;
  local_14a0 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 7) * 2 + -0x10);
  *local_14a0 = in_stack_ffffffffffffe4a8;
  local_14a0[1] = in_stack_ffffffffffffe4b0;
  highbd_transpose8x8_sse2
            (palVar24,(__m128i *)&stack0xffffffffffffe4a8,(__m128i *)&stack0xffffffffffffe4b8,
             (__m128i *)&local_1b38,(__m128i *)&local_1b28,(__m128i *)&local_1b18,x6,x7,x1,d1,l,bl,
             th,palVar23,qs_00,in_stack_ffffffffffffe4a8);
  *local_18a8 = local_1ae8;
  local_18a8[1] = uStack_1ae0;
  puVar11 = (undefined8 *)((long)local_18a8 + (long)local_18ac * 2);
  *puVar11 = local_1af8;
  puVar11[1] = uStack_1af0;
  puVar11 = (undefined8 *)((long)local_18a8 + (long)(local_18ac << 1) * 2);
  *puVar11 = local_1b08;
  puVar11[1] = uStack_1b00;
  plVar12 = (longlong *)((long)local_18a8 + (long)(local_18ac * 3) * 2);
  *plVar12 = local_1b18;
  plVar12[1] = lStack_1b10;
  plVar12 = (longlong *)((long)local_18a8 + (long)(local_18ac << 2) * 2);
  *plVar12 = local_1b28;
  plVar12[1] = lStack_1b20;
  plVar12 = (longlong *)((long)local_18a8 + (long)(local_18ac * 5) * 2);
  *plVar12 = local_1b38;
  plVar12[1] = lStack_1b30;
  puVar11 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 6) * 2);
  *puVar11 = in_stack_ffffffffffffe4b8;
  puVar11[1] = lStack_1b40;
  local_18a8 = (undefined8 *)((long)local_18a8 + (long)(local_18ac * 7) * 2);
  *local_18a8 = in_stack_ffffffffffffe4a8;
  local_18a8[1] = in_stack_ffffffffffffe4b0;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i q[7], p[7];
  __m128i p6, p5, p4, p3, p2, p1, p0, q0;
  __m128i p6_2, p5_2, p4_2, p3_2, p2_2, p1_2, q0_2, p0_2;
  __m128i d0, d7;
  __m128i d0_out, d1_out, d2_out, d3_out, d4_out, d5_out, d6_out, d7_out;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));
  p2 = _mm_loadu_si128((__m128i *)((s - 8) + 4 * pitch));
  p1 = _mm_loadu_si128((__m128i *)((s - 8) + 5 * pitch));
  p0 = _mm_loadu_si128((__m128i *)((s - 8) + 6 * pitch));
  q0 = _mm_loadu_si128((__m128i *)((s - 8) + 7 * pitch));

  highbd_transpose8x8_sse2(&p6, &p5, &p4, &p3, &p2, &p1, &p0, &q0, &d0, &p[6],
                           &p[5], &p[4], &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));
  p2_2 = _mm_loadu_si128((__m128i *)(s + 4 * pitch));
  p1_2 = _mm_loadu_si128((__m128i *)(s + 5 * pitch));
  p0_2 = _mm_loadu_si128((__m128i *)(s + 6 * pitch));
  q0_2 = _mm_loadu_si128((__m128i *)(s + 7 * pitch));

  highbd_transpose8x8_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &p2_2, &p1_2, &p0_2,
                           &q0_2, &q[0], &q[1], &q[2], &q[3], &q[4], &q[5],
                           &q[6], &d7);

  highbd_lpf_internal_14_dual_sse2(p, q, blimit0, limit0, thresh0, blimit1,
                                   limit1, thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &p[6], &p[5], &p[4], &p[3], &p[2], &p[1], &p[0],
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 7 * pitch), d7_out);

  highbd_transpose8x8_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6], &d7,
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s + 7 * pitch), d7_out);
}